

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  uint uVar65;
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  long lVar69;
  ulong uVar70;
  long lVar71;
  uint uVar72;
  float fVar73;
  float fVar98;
  float fVar99;
  vint4 bi_1;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar100;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar74;
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar90 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 extraout_var [56];
  float fVar101;
  float fVar130;
  float fVar131;
  vint4 bi;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar132;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar133;
  float fVar155;
  float fVar156;
  vint4 bi_2;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar157;
  float fVar182;
  float fVar183;
  vint4 ai_1;
  undefined1 auVar158 [16];
  float fVar184;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar185;
  float fVar208;
  float fVar209;
  vint4 ai_2;
  undefined1 auVar186 [16];
  float fVar210;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar211;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar212;
  float fVar231;
  float fVar232;
  undefined1 auVar213 [16];
  float fVar233;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar238 [16];
  undefined1 auVar244 [32];
  vint4 ai;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar279;
  float fVar292;
  float fVar293;
  undefined1 auVar280 [16];
  float fVar294;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [32];
  float fVar303;
  float fVar304;
  float fVar311;
  float fVar313;
  undefined1 auVar305 [16];
  float fVar312;
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar331;
  float fVar332;
  undefined1 auVar325 [16];
  float fVar333;
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar334;
  float fVar335;
  undefined1 auVar330 [32];
  float fVar336;
  float fVar343;
  float fVar344;
  vfloat4 a0;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar346 [16];
  float fVar345;
  float fVar354;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  float fVar352;
  float fVar353;
  undefined1 auVar351 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float fStack_500;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 *local_448;
  Primitive *local_440;
  ulong local_438;
  long local_430;
  RTCFilterFunctionNArguments local_428;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  uint auStack_368 [4];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar181 [32];
  undefined1 auVar350 [32];
  
  PVar11 = prim[1];
  uVar68 = (ulong)(byte)PVar11;
  lVar69 = uVar68 * 0x25;
  fVar74 = *(float *)(prim + lVar69 + 0x12);
  auVar118 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar118 = vinsertps_avx(auVar118,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar165 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar165 = vinsertps_avx(auVar165,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar118 = vsubps_avx(auVar118,*(undefined1 (*) [16])(prim + lVar69 + 6));
  auVar102._0_4_ = fVar74 * auVar118._0_4_;
  auVar102._4_4_ = fVar74 * auVar118._4_4_;
  auVar102._8_4_ = fVar74 * auVar118._8_4_;
  auVar102._12_4_ = fVar74 * auVar118._12_4_;
  auVar245._0_4_ = fVar74 * auVar165._0_4_;
  auVar245._4_4_ = fVar74 * auVar165._4_4_;
  auVar245._8_4_ = fVar74 * auVar165._8_4_;
  auVar245._12_4_ = fVar74 * auVar165._12_4_;
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar165 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar229 = vcvtdq2ps_avx(auVar229);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xf + 6)));
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar68 + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1a + 6)));
  auVar175 = vcvtdq2ps_avx(auVar175);
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1b + 6)));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1c + 6)));
  auVar174 = vcvtdq2ps_avx(auVar174);
  auVar91 = vshufps_avx(auVar245,auVar245,0);
  auVar147 = vshufps_avx(auVar245,auVar245,0x55);
  auVar20 = vshufps_avx(auVar245,auVar245,0xaa);
  fVar74 = auVar20._0_4_;
  fVar133 = auVar20._4_4_;
  fVar155 = auVar20._8_4_;
  fVar156 = auVar20._12_4_;
  fVar185 = auVar147._0_4_;
  fVar208 = auVar147._4_4_;
  fVar209 = auVar147._8_4_;
  fVar210 = auVar147._12_4_;
  fVar157 = auVar91._0_4_;
  fVar182 = auVar91._4_4_;
  fVar183 = auVar91._8_4_;
  fVar184 = auVar91._12_4_;
  auVar317._0_4_ = fVar157 * auVar118._0_4_ + fVar185 * auVar165._0_4_ + fVar74 * auVar229._0_4_;
  auVar317._4_4_ = fVar182 * auVar118._4_4_ + fVar208 * auVar165._4_4_ + fVar133 * auVar229._4_4_;
  auVar317._8_4_ = fVar183 * auVar118._8_4_ + fVar209 * auVar165._8_4_ + fVar155 * auVar229._8_4_;
  auVar317._12_4_ =
       fVar184 * auVar118._12_4_ + fVar210 * auVar165._12_4_ + fVar156 * auVar229._12_4_;
  auVar325._0_4_ = fVar157 * auVar18._0_4_ + fVar185 * auVar143._0_4_ + auVar19._0_4_ * fVar74;
  auVar325._4_4_ = fVar182 * auVar18._4_4_ + fVar208 * auVar143._4_4_ + auVar19._4_4_ * fVar133;
  auVar325._8_4_ = fVar183 * auVar18._8_4_ + fVar209 * auVar143._8_4_ + auVar19._8_4_ * fVar155;
  auVar325._12_4_ = fVar184 * auVar18._12_4_ + fVar210 * auVar143._12_4_ + auVar19._12_4_ * fVar156;
  auVar246._0_4_ = fVar157 * auVar175._0_4_ + fVar185 * auVar117._0_4_ + auVar174._0_4_ * fVar74;
  auVar246._4_4_ = fVar182 * auVar175._4_4_ + fVar208 * auVar117._4_4_ + auVar174._4_4_ * fVar133;
  auVar246._8_4_ = fVar183 * auVar175._8_4_ + fVar209 * auVar117._8_4_ + auVar174._8_4_ * fVar155;
  auVar246._12_4_ =
       fVar184 * auVar175._12_4_ + fVar210 * auVar117._12_4_ + auVar174._12_4_ * fVar156;
  auVar91 = vshufps_avx(auVar102,auVar102,0);
  auVar147 = vshufps_avx(auVar102,auVar102,0x55);
  auVar20 = vshufps_avx(auVar102,auVar102,0xaa);
  fVar74 = auVar20._0_4_;
  fVar133 = auVar20._4_4_;
  fVar155 = auVar20._8_4_;
  fVar156 = auVar20._12_4_;
  fVar185 = auVar147._0_4_;
  fVar208 = auVar147._4_4_;
  fVar209 = auVar147._8_4_;
  fVar210 = auVar147._12_4_;
  fVar157 = auVar91._0_4_;
  fVar182 = auVar91._4_4_;
  fVar183 = auVar91._8_4_;
  fVar184 = auVar91._12_4_;
  auVar103._0_4_ = fVar157 * auVar118._0_4_ + fVar185 * auVar165._0_4_ + fVar74 * auVar229._0_4_;
  auVar103._4_4_ = fVar182 * auVar118._4_4_ + fVar208 * auVar165._4_4_ + fVar133 * auVar229._4_4_;
  auVar103._8_4_ = fVar183 * auVar118._8_4_ + fVar209 * auVar165._8_4_ + fVar155 * auVar229._8_4_;
  auVar103._12_4_ =
       fVar184 * auVar118._12_4_ + fVar210 * auVar165._12_4_ + fVar156 * auVar229._12_4_;
  auVar75._0_4_ = fVar157 * auVar18._0_4_ + auVar19._0_4_ * fVar74 + fVar185 * auVar143._0_4_;
  auVar75._4_4_ = fVar182 * auVar18._4_4_ + auVar19._4_4_ * fVar133 + fVar208 * auVar143._4_4_;
  auVar75._8_4_ = fVar183 * auVar18._8_4_ + auVar19._8_4_ * fVar155 + fVar209 * auVar143._8_4_;
  auVar75._12_4_ = fVar184 * auVar18._12_4_ + auVar19._12_4_ * fVar156 + fVar210 * auVar143._12_4_;
  auVar257._8_4_ = 0x7fffffff;
  auVar257._0_8_ = 0x7fffffff7fffffff;
  auVar257._12_4_ = 0x7fffffff;
  auVar118 = vandps_avx(auVar317,auVar257);
  auVar186._8_4_ = 0x219392ef;
  auVar186._0_8_ = 0x219392ef219392ef;
  auVar186._12_4_ = 0x219392ef;
  auVar118 = vcmpps_avx(auVar118,auVar186,1);
  auVar165 = vblendvps_avx(auVar317,auVar186,auVar118);
  auVar118 = vandps_avx(auVar325,auVar257);
  auVar118 = vcmpps_avx(auVar118,auVar186,1);
  auVar229 = vblendvps_avx(auVar325,auVar186,auVar118);
  auVar118 = vandps_avx(auVar257,auVar246);
  auVar118 = vcmpps_avx(auVar118,auVar186,1);
  auVar118 = vblendvps_avx(auVar246,auVar186,auVar118);
  auVar134._0_4_ = fVar157 * auVar175._0_4_ + fVar185 * auVar117._0_4_ + auVar174._0_4_ * fVar74;
  auVar134._4_4_ = fVar182 * auVar175._4_4_ + fVar208 * auVar117._4_4_ + auVar174._4_4_ * fVar133;
  auVar134._8_4_ = fVar183 * auVar175._8_4_ + fVar209 * auVar117._8_4_ + auVar174._8_4_ * fVar155;
  auVar134._12_4_ =
       fVar184 * auVar175._12_4_ + fVar210 * auVar117._12_4_ + auVar174._12_4_ * fVar156;
  auVar18 = vrcpps_avx(auVar165);
  fVar157 = auVar18._0_4_;
  auVar158._0_4_ = fVar157 * auVar165._0_4_;
  fVar182 = auVar18._4_4_;
  auVar158._4_4_ = fVar182 * auVar165._4_4_;
  fVar183 = auVar18._8_4_;
  auVar158._8_4_ = fVar183 * auVar165._8_4_;
  fVar184 = auVar18._12_4_;
  auVar158._12_4_ = fVar184 * auVar165._12_4_;
  auVar258._8_4_ = 0x3f800000;
  auVar258._0_8_ = &DAT_3f8000003f800000;
  auVar258._12_4_ = 0x3f800000;
  auVar165 = vsubps_avx(auVar258,auVar158);
  fVar157 = fVar157 + fVar157 * auVar165._0_4_;
  fVar182 = fVar182 + fVar182 * auVar165._4_4_;
  fVar183 = fVar183 + fVar183 * auVar165._8_4_;
  fVar184 = fVar184 + fVar184 * auVar165._12_4_;
  auVar165 = vrcpps_avx(auVar229);
  fVar185 = auVar165._0_4_;
  auVar213._0_4_ = fVar185 * auVar229._0_4_;
  fVar208 = auVar165._4_4_;
  auVar213._4_4_ = fVar208 * auVar229._4_4_;
  fVar209 = auVar165._8_4_;
  auVar213._8_4_ = fVar209 * auVar229._8_4_;
  fVar210 = auVar165._12_4_;
  auVar213._12_4_ = fVar210 * auVar229._12_4_;
  auVar165 = vsubps_avx(auVar258,auVar213);
  fVar185 = fVar185 + fVar185 * auVar165._0_4_;
  fVar208 = fVar208 + fVar208 * auVar165._4_4_;
  fVar209 = fVar209 + fVar209 * auVar165._8_4_;
  fVar210 = fVar210 + fVar210 * auVar165._12_4_;
  auVar165 = vrcpps_avx(auVar118);
  fVar212 = auVar165._0_4_;
  auVar234._0_4_ = fVar212 * auVar118._0_4_;
  fVar231 = auVar165._4_4_;
  auVar234._4_4_ = fVar231 * auVar118._4_4_;
  fVar232 = auVar165._8_4_;
  auVar234._8_4_ = fVar232 * auVar118._8_4_;
  fVar233 = auVar165._12_4_;
  auVar234._12_4_ = fVar233 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar258,auVar234);
  fVar212 = fVar212 + fVar212 * auVar118._0_4_;
  fVar231 = fVar231 + fVar231 * auVar118._4_4_;
  fVar232 = fVar232 + fVar232 * auVar118._8_4_;
  fVar233 = fVar233 + fVar233 * auVar118._12_4_;
  auVar118 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar69 + 0x16)) *
                           *(float *)(prim + lVar69 + 0x1a)));
  auVar229 = vshufps_avx(auVar118,auVar118,0);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar118 = vpmovsxwd_avx(auVar118);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar165 = vpmovsxwd_avx(auVar165);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar18 = vsubps_avx(auVar165,auVar118);
  fVar74 = auVar229._0_4_;
  fVar133 = auVar229._4_4_;
  fVar155 = auVar229._8_4_;
  fVar156 = auVar229._12_4_;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar165 = vpmovsxwd_avx(auVar229);
  auVar247._0_4_ = auVar18._0_4_ * fVar74 + auVar118._0_4_;
  auVar247._4_4_ = auVar18._4_4_ * fVar133 + auVar118._4_4_;
  auVar247._8_4_ = auVar18._8_4_ * fVar155 + auVar118._8_4_;
  auVar247._12_4_ = auVar18._12_4_ * fVar156 + auVar118._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar229 = vpmovsxwd_avx(auVar18);
  auVar118 = vcvtdq2ps_avx(auVar165);
  auVar165 = vcvtdq2ps_avx(auVar229);
  auVar165 = vsubps_avx(auVar165,auVar118);
  auVar259._0_4_ = auVar165._0_4_ * fVar74 + auVar118._0_4_;
  auVar259._4_4_ = auVar165._4_4_ * fVar133 + auVar118._4_4_;
  auVar259._8_4_ = auVar165._8_4_ * fVar155 + auVar118._8_4_;
  auVar259._12_4_ = auVar165._12_4_ * fVar156 + auVar118._12_4_;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar118 = vpmovsxwd_avx(auVar143);
  uVar70 = (ulong)(uint)((int)(uVar68 * 5) << 2);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar68 * 2 + uVar70 + 6);
  auVar165 = vpmovsxwd_avx(auVar19);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar118);
  auVar280._0_4_ = auVar165._0_4_ * fVar74 + auVar118._0_4_;
  auVar280._4_4_ = auVar165._4_4_ * fVar133 + auVar118._4_4_;
  auVar280._8_4_ = auVar165._8_4_ * fVar155 + auVar118._8_4_;
  auVar280._12_4_ = auVar165._12_4_ * fVar156 + auVar118._12_4_;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar70 + 6);
  auVar118 = vpmovsxwd_avx(auVar175);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar68 * 0x18 + 6);
  auVar165 = vpmovsxwd_avx(auVar117);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar229 = vsubps_avx(auVar165,auVar118);
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + uVar68 * 0x1d + 6);
  auVar165 = vpmovsxwd_avx(auVar174);
  auVar295._0_4_ = auVar229._0_4_ * fVar74 + auVar118._0_4_;
  auVar295._4_4_ = auVar229._4_4_ * fVar133 + auVar118._4_4_;
  auVar295._8_4_ = auVar229._8_4_ * fVar155 + auVar118._8_4_;
  auVar295._12_4_ = auVar229._12_4_ * fVar156 + auVar118._12_4_;
  auVar118 = vcvtdq2ps_avx(auVar165);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar68 + (ulong)(byte)PVar11 * 0x20 + 6);
  auVar165 = vpmovsxwd_avx(auVar91);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar118);
  auVar305._0_4_ = auVar165._0_4_ * fVar74 + auVar118._0_4_;
  auVar305._4_4_ = auVar165._4_4_ * fVar133 + auVar118._4_4_;
  auVar305._8_4_ = auVar165._8_4_ * fVar155 + auVar118._8_4_;
  auVar305._12_4_ = auVar165._12_4_ * fVar156 + auVar118._12_4_;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar11 * 0x20 - uVar68) + 6);
  auVar118 = vpmovsxwd_avx(auVar147);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar68 * 0x23 + 6);
  auVar165 = vpmovsxwd_avx(auVar20);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar118);
  auVar235._0_4_ = auVar118._0_4_ + auVar165._0_4_ * fVar74;
  auVar235._4_4_ = auVar118._4_4_ + auVar165._4_4_ * fVar133;
  auVar235._8_4_ = auVar118._8_4_ + auVar165._8_4_ * fVar155;
  auVar235._12_4_ = auVar118._12_4_ + auVar165._12_4_ * fVar156;
  auVar118 = vsubps_avx(auVar247,auVar103);
  auVar248._0_4_ = fVar157 * auVar118._0_4_;
  auVar248._4_4_ = fVar182 * auVar118._4_4_;
  auVar248._8_4_ = fVar183 * auVar118._8_4_;
  auVar248._12_4_ = fVar184 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar259,auVar103);
  auVar104._0_4_ = fVar157 * auVar118._0_4_;
  auVar104._4_4_ = fVar182 * auVar118._4_4_;
  auVar104._8_4_ = fVar183 * auVar118._8_4_;
  auVar104._12_4_ = fVar184 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar280,auVar75);
  auVar159._0_4_ = fVar185 * auVar118._0_4_;
  auVar159._4_4_ = fVar208 * auVar118._4_4_;
  auVar159._8_4_ = fVar209 * auVar118._8_4_;
  auVar159._12_4_ = fVar210 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar295,auVar75);
  auVar76._0_4_ = fVar185 * auVar118._0_4_;
  auVar76._4_4_ = fVar208 * auVar118._4_4_;
  auVar76._8_4_ = fVar209 * auVar118._8_4_;
  auVar76._12_4_ = fVar210 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar305,auVar134);
  auVar187._0_4_ = fVar212 * auVar118._0_4_;
  auVar187._4_4_ = fVar231 * auVar118._4_4_;
  auVar187._8_4_ = fVar232 * auVar118._8_4_;
  auVar187._12_4_ = fVar233 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar235,auVar134);
  auVar135._0_4_ = fVar212 * auVar118._0_4_;
  auVar135._4_4_ = fVar231 * auVar118._4_4_;
  auVar135._8_4_ = fVar232 * auVar118._8_4_;
  auVar135._12_4_ = fVar233 * auVar118._12_4_;
  auVar118 = vpminsd_avx(auVar248,auVar104);
  auVar165 = vpminsd_avx(auVar159,auVar76);
  auVar118 = vmaxps_avx(auVar118,auVar165);
  auVar165 = vpminsd_avx(auVar187,auVar135);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar260._4_4_ = uVar9;
  auVar260._0_4_ = uVar9;
  auVar260._8_4_ = uVar9;
  auVar260._12_4_ = uVar9;
  auVar165 = vmaxps_avx(auVar165,auVar260);
  auVar118 = vmaxps_avx(auVar118,auVar165);
  local_338._0_4_ = auVar118._0_4_ * 0.99999964;
  local_338._4_4_ = auVar118._4_4_ * 0.99999964;
  local_338._8_4_ = auVar118._8_4_ * 0.99999964;
  local_338._12_4_ = auVar118._12_4_ * 0.99999964;
  auVar118 = vpmaxsd_avx(auVar248,auVar104);
  auVar165 = vpmaxsd_avx(auVar159,auVar76);
  auVar118 = vminps_avx(auVar118,auVar165);
  auVar165 = vpmaxsd_avx(auVar187,auVar135);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar136._4_4_ = uVar9;
  auVar136._0_4_ = uVar9;
  auVar136._8_4_ = uVar9;
  auVar136._12_4_ = uVar9;
  auVar165 = vminps_avx(auVar165,auVar136);
  auVar118 = vminps_avx(auVar118,auVar165);
  auVar77._0_4_ = auVar118._0_4_ * 1.0000004;
  auVar77._4_4_ = auVar118._4_4_ * 1.0000004;
  auVar77._8_4_ = auVar118._8_4_ * 1.0000004;
  auVar77._12_4_ = auVar118._12_4_ * 1.0000004;
  auVar118 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar165 = vpcmpgtd_avx(auVar118,_DAT_01ff0cf0);
  auVar118 = vcmpps_avx(local_338,auVar77,2);
  auVar118 = vandps_avx(auVar118,auVar165);
  uVar65 = vmovmskps_avx(auVar118);
  if (uVar65 == 0) {
    return;
  }
  uVar65 = uVar65 & 0xff;
  auVar94._16_16_ = mm_lookupmask_ps._240_16_;
  auVar94._0_16_ = mm_lookupmask_ps._240_16_;
  local_228 = vblendps_avx(auVar94,ZEXT832(0) << 0x20,0x80);
  local_448 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar351 = ZEXT464(0) << 0x20;
  local_440 = prim;
LAB_00ffbef7:
  lVar69 = 0;
  if ((ulong)uVar65 != 0) {
    for (; (uVar65 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
    }
  }
  uVar67 = *(uint *)(local_440 + 2);
  local_438 = (ulong)*(uint *)(local_440 + lVar69 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[uVar67].ptr;
  fVar74 = (pGVar12->time_range).lower;
  fVar74 = pGVar12->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar74) / ((pGVar12->time_range).upper - fVar74));
  auVar118 = vroundss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74),9);
  auVar118 = vminss_avx(auVar118,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar118 = vmaxss_avx(ZEXT816(0) << 0x20,auVar118);
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           local_438 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar71 = (long)(int)auVar118._0_4_ * 0x38;
  lVar14 = *(long *)(_Var13 + lVar71);
  lVar15 = *(long *)(_Var13 + 0x10 + lVar71);
  pfVar4 = (float *)(lVar14 + lVar15 * uVar68);
  fVar133 = *pfVar4;
  fVar155 = pfVar4[1];
  fVar156 = pfVar4[2];
  fVar157 = pfVar4[3];
  lVar1 = uVar68 + 1;
  pfVar4 = (float *)(lVar14 + lVar15 * lVar1);
  lVar2 = uVar68 + 2;
  pfVar5 = (float *)(lVar14 + lVar15 * lVar2);
  lVar3 = uVar68 + 3;
  pfVar6 = (float *)(lVar14 + lVar15 * lVar3);
  fVar182 = *pfVar6;
  fVar183 = pfVar6[1];
  fVar184 = pfVar6[2];
  fVar185 = pfVar6[3];
  lVar14 = *(long *)&pGVar12[4].fnumTimeSegments;
  lVar15 = *(long *)(lVar14 + lVar71);
  lVar16 = *(long *)(lVar14 + 0x10 + lVar71);
  pfVar6 = (float *)(lVar15 + lVar16 * uVar68);
  fVar208 = *pfVar6;
  fVar209 = pfVar6[1];
  fVar210 = pfVar6[2];
  fVar212 = pfVar6[3];
  pfVar6 = (float *)(lVar15 + lVar16 * lVar1);
  pfVar7 = (float *)(lVar15 + lVar16 * lVar2);
  fVar74 = fVar74 - auVar118._0_4_;
  pfVar8 = (float *)(lVar15 + lVar16 * lVar3);
  fVar231 = *pfVar8;
  fVar232 = pfVar8[1];
  fVar233 = pfVar8[2];
  fVar211 = pfVar8[3];
  fVar304 = auVar351._8_4_;
  fVar312 = auVar351._12_4_;
  fVar279 = *pfVar5 * 0.0;
  fVar292 = pfVar5[1] * 0.0;
  fVar293 = fVar304 * pfVar5[2];
  fVar294 = fVar312 * pfVar5[3];
  fVar73 = fVar279 + fVar182 * 0.0;
  fVar98 = fVar292 + fVar183 * 0.0;
  fVar99 = fVar293 + fVar304 * fVar184;
  fVar100 = fVar294 + fVar312 * fVar185;
  fVar303 = *pfVar4 * 0.0;
  fVar311 = pfVar4[1] * 0.0;
  fVar313 = fVar304 * pfVar4[2];
  fVar315 = fVar312 * pfVar4[3];
  local_5e8._0_4_ = fVar133 + fVar303 + fVar73;
  local_5e8._4_4_ = fVar155 + fVar311 + fVar98;
  fStack_5e0 = fVar156 + fVar313 + fVar99;
  fStack_5dc = fVar157 + fVar315 + fVar100;
  auVar78._0_4_ = *pfVar4 * 3.0 + fVar73;
  auVar78._4_4_ = pfVar4[1] * 3.0 + fVar98;
  auVar78._8_4_ = pfVar4[2] * 3.0 + fVar99;
  auVar78._12_4_ = pfVar4[3] * 3.0 + fVar100;
  auVar137._0_4_ = fVar133 * 3.0;
  auVar137._4_4_ = fVar155 * 3.0;
  auVar137._8_4_ = fVar156 * 3.0;
  auVar137._12_4_ = fVar157 * 3.0;
  auVar117 = vsubps_avx(auVar78,auVar137);
  fVar101 = *pfVar7 * 0.0;
  fVar130 = pfVar7[1] * 0.0;
  fVar131 = pfVar7[2] * fVar304;
  fVar132 = pfVar7[3] * fVar312;
  fVar73 = fVar101 + fVar231 * 0.0;
  fVar98 = fVar130 + fVar232 * 0.0;
  fVar99 = fVar131 + fVar233 * fVar304;
  fVar100 = fVar132 + fVar211 * fVar312;
  fVar324 = *pfVar6 * 0.0;
  fVar331 = pfVar6[1] * 0.0;
  fVar332 = fVar304 * pfVar6[2];
  fVar333 = fVar312 * pfVar6[3];
  auVar337._0_4_ = fVar324 + fVar73 + fVar208;
  auVar337._4_4_ = fVar331 + fVar98 + fVar209;
  auVar337._8_4_ = fVar332 + fVar99 + fVar210;
  auVar337._12_4_ = fVar333 + fVar100 + fVar212;
  auVar79._0_4_ = *pfVar6 * 3.0 + fVar73;
  auVar79._4_4_ = pfVar6[1] * 3.0 + fVar98;
  auVar79._8_4_ = pfVar6[2] * 3.0 + fVar99;
  auVar79._12_4_ = pfVar6[3] * 3.0 + fVar100;
  auVar236._0_4_ = fVar208 * 3.0;
  auVar236._4_4_ = fVar209 * 3.0;
  auVar236._8_4_ = fVar210 * 3.0;
  auVar236._12_4_ = fVar212 * 3.0;
  auVar18 = vsubps_avx(auVar79,auVar236);
  auVar160._0_4_ = fVar133 * 0.0;
  auVar160._4_4_ = fVar155 * 0.0;
  auVar160._8_4_ = fVar304 * fVar156;
  auVar160._12_4_ = fVar312 * fVar157;
  auVar237._0_4_ = auVar160._0_4_ + fVar303 + fVar279 + fVar182;
  auVar237._4_4_ = auVar160._4_4_ + fVar311 + fVar292 + fVar183;
  auVar237._8_4_ = auVar160._8_4_ + fVar313 + fVar293 + fVar184;
  auVar237._12_4_ = auVar160._12_4_ + fVar315 + fVar294 + fVar185;
  auVar249._0_4_ = fVar182 * 3.0;
  auVar249._4_4_ = fVar183 * 3.0;
  auVar249._8_4_ = fVar184 * 3.0;
  auVar249._12_4_ = fVar185 * 3.0;
  auVar188._0_4_ = *pfVar5 * 3.0;
  auVar188._4_4_ = pfVar5[1] * 3.0;
  auVar188._8_4_ = pfVar5[2] * 3.0;
  auVar188._12_4_ = pfVar5[3] * 3.0;
  auVar118 = vsubps_avx(auVar249,auVar188);
  auVar189._0_4_ = fVar303 + auVar118._0_4_;
  auVar189._4_4_ = fVar311 + auVar118._4_4_;
  auVar189._8_4_ = fVar313 + auVar118._8_4_;
  auVar189._12_4_ = fVar315 + auVar118._12_4_;
  auVar174 = vsubps_avx(auVar189,auVar160);
  auVar190._0_4_ = fVar208 * 0.0;
  auVar190._4_4_ = fVar209 * 0.0;
  auVar190._8_4_ = fVar304 * fVar210;
  auVar190._12_4_ = fVar312 * fVar212;
  auVar161._0_4_ = auVar190._0_4_ + fVar324 + fVar231 + fVar101;
  auVar161._4_4_ = auVar190._4_4_ + fVar331 + fVar232 + fVar130;
  auVar161._8_4_ = auVar190._8_4_ + fVar332 + fVar233 + fVar131;
  auVar161._12_4_ = auVar190._12_4_ + fVar333 + fVar211 + fVar132;
  auVar214._0_4_ = fVar231 * 3.0;
  auVar214._4_4_ = fVar232 * 3.0;
  auVar214._8_4_ = fVar233 * 3.0;
  auVar214._12_4_ = fVar211 * 3.0;
  auVar250._0_4_ = *pfVar7 * 3.0;
  auVar250._4_4_ = pfVar7[1] * 3.0;
  auVar250._8_4_ = pfVar7[2] * 3.0;
  auVar250._12_4_ = pfVar7[3] * 3.0;
  auVar118 = vsubps_avx(auVar214,auVar250);
  auVar215._0_4_ = fVar324 + auVar118._0_4_;
  auVar215._4_4_ = fVar331 + auVar118._4_4_;
  auVar215._8_4_ = fVar332 + auVar118._8_4_;
  auVar215._12_4_ = fVar333 + auVar118._12_4_;
  auVar19 = vsubps_avx(auVar215,auVar190);
  auVar118 = vshufps_avx(auVar117,auVar117,0xc9);
  auVar165 = vshufps_avx(auVar337,auVar337,0xc9);
  fVar73 = auVar117._0_4_;
  auVar216._0_4_ = fVar73 * auVar165._0_4_;
  fVar98 = auVar117._4_4_;
  auVar216._4_4_ = fVar98 * auVar165._4_4_;
  fVar99 = auVar117._8_4_;
  auVar216._8_4_ = fVar99 * auVar165._8_4_;
  fVar100 = auVar117._12_4_;
  auVar216._12_4_ = fVar100 * auVar165._12_4_;
  auVar261._0_4_ = auVar337._0_4_ * auVar118._0_4_;
  auVar261._4_4_ = auVar337._4_4_ * auVar118._4_4_;
  auVar261._8_4_ = auVar337._8_4_ * auVar118._8_4_;
  auVar261._12_4_ = auVar337._12_4_ * auVar118._12_4_;
  auVar165 = vsubps_avx(auVar261,auVar216);
  auVar229 = vshufps_avx(auVar165,auVar165,0xc9);
  auVar165 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar262._0_4_ = auVar165._0_4_ * fVar73;
  auVar262._4_4_ = auVar165._4_4_ * fVar98;
  auVar262._8_4_ = auVar165._8_4_ * fVar99;
  auVar262._12_4_ = auVar165._12_4_ * fVar100;
  auVar80._0_4_ = auVar118._0_4_ * auVar18._0_4_;
  auVar80._4_4_ = auVar118._4_4_ * auVar18._4_4_;
  auVar80._8_4_ = auVar118._8_4_ * auVar18._8_4_;
  auVar80._12_4_ = auVar118._12_4_ * auVar18._12_4_;
  auVar118 = vsubps_avx(auVar80,auVar262);
  auVar18 = vshufps_avx(auVar118,auVar118,0xc9);
  auVar118 = vshufps_avx(auVar174,auVar174,0xc9);
  auVar165 = vshufps_avx(auVar161,auVar161,0xc9);
  fVar324 = auVar174._0_4_;
  auVar263._0_4_ = fVar324 * auVar165._0_4_;
  fVar331 = auVar174._4_4_;
  auVar263._4_4_ = fVar331 * auVar165._4_4_;
  fVar332 = auVar174._8_4_;
  auVar263._8_4_ = fVar332 * auVar165._8_4_;
  fVar333 = auVar174._12_4_;
  auVar263._12_4_ = fVar333 * auVar165._12_4_;
  auVar162._0_4_ = auVar118._0_4_ * auVar161._0_4_;
  auVar162._4_4_ = auVar118._4_4_ * auVar161._4_4_;
  auVar162._8_4_ = auVar118._8_4_ * auVar161._8_4_;
  auVar162._12_4_ = auVar118._12_4_ * auVar161._12_4_;
  auVar165 = vsubps_avx(auVar162,auVar263);
  auVar143 = vshufps_avx(auVar165,auVar165,0xc9);
  auVar165 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar264._0_4_ = fVar324 * auVar165._0_4_;
  auVar264._4_4_ = fVar331 * auVar165._4_4_;
  auVar264._8_4_ = fVar332 * auVar165._8_4_;
  auVar264._12_4_ = fVar333 * auVar165._12_4_;
  auVar191._0_4_ = auVar118._0_4_ * auVar19._0_4_;
  auVar191._4_4_ = auVar118._4_4_ * auVar19._4_4_;
  auVar191._8_4_ = auVar118._8_4_ * auVar19._8_4_;
  auVar191._12_4_ = auVar118._12_4_ * auVar19._12_4_;
  auVar118 = vdpps_avx(auVar229,auVar229,0x7f);
  auVar165 = vsubps_avx(auVar191,auVar264);
  auVar19 = vshufps_avx(auVar165,auVar165,0xc9);
  fVar155 = auVar118._0_4_;
  auVar265._4_12_ = auVar351._4_12_;
  auVar265._0_4_ = fVar155;
  auVar165 = vrsqrtss_avx(auVar265,auVar265);
  fVar133 = auVar165._0_4_;
  auVar165 = ZEXT416((uint)(fVar133 * 1.5 - fVar155 * 0.5 * fVar133 * fVar133 * fVar133));
  auVar175 = vshufps_avx(auVar165,auVar165,0);
  fVar231 = auVar175._0_4_ * auVar229._0_4_;
  fVar232 = auVar175._4_4_ * auVar229._4_4_;
  fVar233 = auVar175._8_4_ * auVar229._8_4_;
  fVar211 = auVar175._12_4_ * auVar229._12_4_;
  auVar165 = vdpps_avx(auVar229,auVar18,0x7f);
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar81._0_4_ = auVar118._0_4_ * auVar18._0_4_;
  auVar81._4_4_ = auVar118._4_4_ * auVar18._4_4_;
  auVar81._8_4_ = auVar118._8_4_ * auVar18._8_4_;
  auVar81._12_4_ = auVar118._12_4_ * auVar18._12_4_;
  auVar118 = vshufps_avx(auVar165,auVar165,0);
  auVar217._0_4_ = auVar118._0_4_ * auVar229._0_4_;
  auVar217._4_4_ = auVar118._4_4_ * auVar229._4_4_;
  auVar217._8_4_ = auVar118._8_4_ * auVar229._8_4_;
  auVar217._12_4_ = auVar118._12_4_ * auVar229._12_4_;
  auVar91 = vsubps_avx(auVar81,auVar217);
  auVar118 = vrcpss_avx(auVar265,auVar265);
  auVar118 = ZEXT416((uint)(auVar118._0_4_ * (2.0 - fVar155 * auVar118._0_4_)));
  auVar229 = vshufps_avx(auVar118,auVar118,0);
  auVar118 = vdpps_avx(auVar143,auVar143,0x7f);
  fVar101 = auVar118._0_4_;
  auVar266._4_12_ = auVar351._4_12_;
  auVar266._0_4_ = fVar101;
  auVar165 = vrsqrtss_avx(auVar266,auVar266);
  fVar208 = auVar165._0_4_;
  auVar165 = vdpps_avx(auVar143,auVar19,0x7f);
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar346._0_4_ = auVar19._0_4_ * auVar118._0_4_;
  auVar346._4_4_ = auVar19._4_4_ * auVar118._4_4_;
  auVar346._8_4_ = auVar19._8_4_ * auVar118._8_4_;
  auVar346._12_4_ = auVar19._12_4_ * auVar118._12_4_;
  lVar15 = *(long *)(_Var13 + 0x38 + lVar71);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar71);
  pfVar4 = (float *)(lVar15 + lVar16 * uVar68);
  fVar133 = *pfVar4;
  fVar155 = pfVar4[1];
  fVar156 = pfVar4[2];
  fVar157 = pfVar4[3];
  pfVar4 = (float *)(lVar15 + lVar16 * lVar1);
  pfVar5 = (float *)(lVar15 + lVar16 * lVar2);
  auVar118 = vshufps_avx(auVar165,auVar165,0);
  auVar82._0_4_ = auVar143._0_4_ * auVar118._0_4_;
  auVar82._4_4_ = auVar143._4_4_ * auVar118._4_4_;
  auVar82._8_4_ = auVar143._8_4_ * auVar118._8_4_;
  auVar82._12_4_ = auVar143._12_4_ * auVar118._12_4_;
  auVar19 = vsubps_avx(auVar346,auVar82);
  pfVar6 = (float *)(lVar15 + lVar16 * lVar3);
  fVar182 = *pfVar6;
  fVar183 = pfVar6[1];
  fVar184 = pfVar6[2];
  fVar185 = pfVar6[3];
  auVar118 = ZEXT416((uint)(fVar208 * 1.5 - fVar101 * 0.5 * fVar208 * fVar208 * fVar208));
  auVar165 = vshufps_avx(auVar118,auVar118,0);
  fVar208 = auVar165._0_4_ * auVar143._0_4_;
  fVar209 = auVar165._4_4_ * auVar143._4_4_;
  fVar210 = auVar165._8_4_ * auVar143._8_4_;
  fVar212 = auVar165._12_4_ * auVar143._12_4_;
  auVar118 = vrcpss_avx(auVar266,auVar266);
  auVar118 = ZEXT416((uint)(auVar118._0_4_ * (2.0 - auVar118._0_4_ * fVar101)));
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar18 = vshufps_avx(_local_5e8,_local_5e8,0xff);
  auVar338._0_4_ = auVar18._0_4_ * fVar231;
  auVar338._4_4_ = auVar18._4_4_ * fVar232;
  auVar338._8_4_ = auVar18._8_4_ * fVar233;
  auVar338._12_4_ = auVar18._12_4_ * fVar211;
  auVar143 = vshufps_avx(auVar117,auVar117,0xff);
  auVar147 = vsubps_avx(_local_5e8,auVar338);
  auVar251._0_4_ =
       auVar143._0_4_ * fVar231 + auVar18._0_4_ * auVar175._0_4_ * auVar91._0_4_ * auVar229._0_4_;
  auVar251._4_4_ =
       auVar143._4_4_ * fVar232 + auVar18._4_4_ * auVar175._4_4_ * auVar91._4_4_ * auVar229._4_4_;
  auVar251._8_4_ =
       auVar143._8_4_ * fVar233 + auVar18._8_4_ * auVar175._8_4_ * auVar91._8_4_ * auVar229._8_4_;
  auVar251._12_4_ =
       auVar143._12_4_ * fVar211 +
       auVar18._12_4_ * auVar175._12_4_ * auVar91._12_4_ * auVar229._12_4_;
  auVar91 = vsubps_avx(auVar117,auVar251);
  local_5e8._0_4_ = (float)local_5e8._0_4_ + auVar338._0_4_;
  local_5e8._4_4_ = (float)local_5e8._4_4_ + auVar338._4_4_;
  fStack_5e0 = fStack_5e0 + auVar338._8_4_;
  fStack_5dc = fStack_5dc + auVar338._12_4_;
  auVar229 = vshufps_avx(auVar237,auVar237,0xff);
  auVar138._0_4_ = auVar229._0_4_ * fVar208;
  auVar138._4_4_ = auVar229._4_4_ * fVar209;
  auVar138._8_4_ = auVar229._8_4_ * fVar210;
  auVar138._12_4_ = auVar229._12_4_ * fVar212;
  auVar18 = vshufps_avx(auVar174,auVar174,0xff);
  auVar20 = vsubps_avx(auVar237,auVar138);
  auVar83._0_4_ =
       auVar18._0_4_ * fVar208 + auVar229._0_4_ * auVar165._0_4_ * auVar19._0_4_ * auVar118._0_4_;
  auVar83._4_4_ =
       auVar18._4_4_ * fVar209 + auVar229._4_4_ * auVar165._4_4_ * auVar19._4_4_ * auVar118._4_4_;
  auVar83._8_4_ =
       auVar18._8_4_ * fVar210 + auVar229._8_4_ * auVar165._8_4_ * auVar19._8_4_ * auVar118._8_4_;
  auVar83._12_4_ =
       auVar18._12_4_ * fVar212 +
       auVar229._12_4_ * auVar165._12_4_ * auVar19._12_4_ * auVar118._12_4_;
  auVar174 = vsubps_avx(auVar174,auVar83);
  local_538._4_4_ = auVar237._4_4_ + auVar138._4_4_;
  local_538._0_4_ = auVar237._0_4_ + auVar138._0_4_;
  fStack_530 = auVar237._8_4_ + auVar138._8_4_;
  fStack_52c = auVar237._12_4_ + auVar138._12_4_;
  fVar279 = *pfVar5 * 0.0;
  fVar292 = pfVar5[1] * 0.0;
  fVar293 = pfVar5[2] * 0.0;
  fVar294 = pfVar5[3] * 0.0;
  fVar345 = fVar279 + fVar182 * 0.0;
  fVar352 = fVar292 + fVar183 * 0.0;
  fVar353 = fVar293 + fVar184 * 0.0;
  fVar354 = fVar294 + fVar185 * 0.0;
  auVar84._0_4_ = fVar345 + *pfVar4 * 3.0;
  auVar84._4_4_ = fVar352 + pfVar4[1] * 3.0;
  auVar84._8_4_ = fVar353 + pfVar4[2] * 3.0;
  auVar84._12_4_ = fVar354 + pfVar4[3] * 3.0;
  auVar139._0_4_ = fVar133 * 3.0;
  auVar139._4_4_ = fVar155 * 3.0;
  auVar139._8_4_ = fVar156 * 3.0;
  auVar139._12_4_ = fVar157 * 3.0;
  auVar75 = vsubps_avx(auVar84,auVar139);
  lVar15 = *(long *)(lVar14 + 0x38 + lVar71);
  lVar14 = *(long *)(lVar14 + 0x48 + lVar71);
  pfVar6 = (float *)(lVar15 + lVar2 * lVar14);
  pfVar7 = (float *)(lVar15 + lVar14 * lVar3);
  fVar208 = *pfVar7;
  fVar209 = pfVar7[1];
  fVar210 = pfVar7[2];
  fVar212 = pfVar7[3];
  fVar101 = *pfVar6 * 0.0;
  fVar130 = pfVar6[1] * 0.0;
  fVar131 = pfVar6[2] * 0.0;
  fVar132 = pfVar6[3] * 0.0;
  fVar303 = fVar101 + fVar208 * 0.0;
  fVar311 = fVar130 + fVar209 * 0.0;
  fVar313 = fVar131 + fVar210 * 0.0;
  fVar315 = fVar132 + fVar212 * 0.0;
  pfVar7 = (float *)(lVar15 + lVar1 * lVar14);
  auVar339._0_4_ = *pfVar7 * 3.0 + fVar303;
  auVar339._4_4_ = pfVar7[1] * 3.0 + fVar311;
  auVar339._8_4_ = pfVar7[2] * 3.0 + fVar313;
  auVar339._12_4_ = pfVar7[3] * 3.0 + fVar315;
  pfVar8 = (float *)(lVar15 + uVar68 * lVar14);
  fVar231 = *pfVar8;
  fVar232 = pfVar8[1];
  fVar233 = pfVar8[2];
  fVar211 = pfVar8[3];
  auVar267._0_4_ = fVar231 * 3.0;
  auVar267._4_4_ = fVar232 * 3.0;
  auVar267._8_4_ = fVar233 * 3.0;
  auVar267._12_4_ = fVar211 * 3.0;
  auVar165 = vsubps_avx(auVar339,auVar267);
  auVar268._0_4_ = fVar182 * 3.0;
  auVar268._4_4_ = fVar183 * 3.0;
  auVar268._8_4_ = fVar184 * 3.0;
  auVar268._12_4_ = fVar185 * 3.0;
  auVar318._0_4_ = *pfVar5 * 3.0;
  auVar318._4_4_ = pfVar5[1] * 3.0;
  auVar318._8_4_ = pfVar5[2] * 3.0;
  auVar318._12_4_ = pfVar5[3] * 3.0;
  auVar118 = vsubps_avx(auVar268,auVar318);
  fVar304 = *pfVar4 * 0.0;
  fVar312 = pfVar4[1] * 0.0;
  fVar314 = pfVar4[2] * 0.0;
  fVar316 = pfVar4[3] * 0.0;
  auVar269._0_4_ = fVar304 + auVar118._0_4_;
  auVar269._4_4_ = fVar312 + auVar118._4_4_;
  auVar269._8_4_ = fVar314 + auVar118._8_4_;
  auVar269._12_4_ = fVar316 + auVar118._12_4_;
  auVar319._0_4_ = fVar133 + fVar304 + fVar345;
  auVar319._4_4_ = fVar155 + fVar312 + fVar352;
  auVar319._8_4_ = fVar156 + fVar314 + fVar353;
  auVar319._12_4_ = fVar157 + fVar316 + fVar354;
  auVar296._0_4_ = fVar133 * 0.0;
  auVar296._4_4_ = fVar155 * 0.0;
  auVar296._8_4_ = fVar156 * 0.0;
  auVar296._12_4_ = fVar157 * 0.0;
  local_588._0_4_ = auVar296._0_4_ + fVar304 + fVar182 + fVar279;
  local_588._4_4_ = auVar296._4_4_ + fVar312 + fVar183 + fVar292;
  fStack_580 = auVar296._8_4_ + fVar314 + fVar184 + fVar293;
  fStack_57c = auVar296._12_4_ + fVar316 + fVar185 + fVar294;
  auVar76 = vsubps_avx(auVar269,auVar296);
  auVar105._0_4_ = fVar208 * 3.0;
  auVar105._4_4_ = fVar209 * 3.0;
  auVar105._8_4_ = fVar210 * 3.0;
  auVar105._12_4_ = fVar212 * 3.0;
  auVar192._0_4_ = *pfVar6 * 3.0;
  auVar192._4_4_ = pfVar6[1] * 3.0;
  auVar192._8_4_ = pfVar6[2] * 3.0;
  auVar192._12_4_ = pfVar6[3] * 3.0;
  auVar118 = vsubps_avx(auVar105,auVar192);
  fVar133 = *pfVar7 * 0.0;
  fVar155 = pfVar7[1] * 0.0;
  fVar156 = pfVar7[2] * 0.0;
  fVar157 = pfVar7[3] * 0.0;
  auVar106._0_4_ = fVar133 + auVar118._0_4_;
  auVar106._4_4_ = fVar155 + auVar118._4_4_;
  auVar106._8_4_ = fVar156 + auVar118._8_4_;
  auVar106._12_4_ = fVar157 + auVar118._12_4_;
  auVar140._0_4_ = fVar231 + fVar133 + fVar303;
  auVar140._4_4_ = fVar232 + fVar155 + fVar311;
  auVar140._8_4_ = fVar233 + fVar156 + fVar313;
  auVar140._12_4_ = fVar211 + fVar157 + fVar315;
  auVar85._0_4_ = fVar231 * 0.0;
  auVar85._4_4_ = fVar232 * 0.0;
  auVar85._8_4_ = fVar233 * 0.0;
  auVar85._12_4_ = fVar211 * 0.0;
  auVar163._0_4_ = auVar85._0_4_ + fVar133 + fVar101 + fVar208;
  auVar163._4_4_ = auVar85._4_4_ + fVar155 + fVar130 + fVar209;
  auVar163._8_4_ = auVar85._8_4_ + fVar156 + fVar131 + fVar210;
  auVar163._12_4_ = auVar85._12_4_ + fVar157 + fVar132 + fVar212;
  auVar18 = vsubps_avx(auVar106,auVar85);
  auVar118 = vshufps_avx(auVar140,auVar140,0xc9);
  fVar185 = auVar75._0_4_;
  auVar107._0_4_ = fVar185 * auVar118._0_4_;
  fVar208 = auVar75._4_4_;
  auVar107._4_4_ = fVar208 * auVar118._4_4_;
  fVar209 = auVar75._8_4_;
  auVar107._8_4_ = fVar209 * auVar118._8_4_;
  fVar210 = auVar75._12_4_;
  auVar107._12_4_ = fVar210 * auVar118._12_4_;
  auVar118 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar141._0_4_ = auVar118._0_4_ * auVar140._0_4_;
  auVar141._4_4_ = auVar118._4_4_ * auVar140._4_4_;
  auVar141._8_4_ = auVar118._8_4_ * auVar140._8_4_;
  auVar141._12_4_ = auVar118._12_4_ * auVar140._12_4_;
  auVar229 = vsubps_avx(auVar141,auVar107);
  auVar142._0_4_ = auVar165._0_4_ * auVar118._0_4_;
  auVar142._4_4_ = auVar165._4_4_ * auVar118._4_4_;
  auVar142._8_4_ = auVar165._8_4_ * auVar118._8_4_;
  auVar142._12_4_ = auVar165._12_4_ * auVar118._12_4_;
  auVar118 = vshufps_avx(auVar165,auVar165,0xc9);
  auVar193._0_4_ = fVar185 * auVar118._0_4_;
  auVar193._4_4_ = fVar208 * auVar118._4_4_;
  auVar193._8_4_ = fVar209 * auVar118._8_4_;
  auVar193._12_4_ = fVar210 * auVar118._12_4_;
  auVar143 = vsubps_avx(auVar142,auVar193);
  auVar118 = vshufps_avx(auVar163,auVar163,0xc9);
  fVar211 = auVar76._0_4_;
  auVar194._0_4_ = fVar211 * auVar118._0_4_;
  fVar101 = auVar76._4_4_;
  auVar194._4_4_ = fVar101 * auVar118._4_4_;
  fVar130 = auVar76._8_4_;
  auVar194._8_4_ = fVar130 * auVar118._8_4_;
  fVar131 = auVar76._12_4_;
  auVar194._12_4_ = fVar131 * auVar118._12_4_;
  auVar118 = vshufps_avx(auVar76,auVar76,0xc9);
  auVar164._0_4_ = auVar118._0_4_ * auVar163._0_4_;
  auVar164._4_4_ = auVar118._4_4_ * auVar163._4_4_;
  auVar164._8_4_ = auVar118._8_4_ * auVar163._8_4_;
  auVar164._12_4_ = auVar118._12_4_ * auVar163._12_4_;
  auVar19 = vsubps_avx(auVar164,auVar194);
  auVar229 = vshufps_avx(auVar229,auVar229,0xc9);
  auVar108._0_4_ = auVar118._0_4_ * auVar18._0_4_;
  auVar108._4_4_ = auVar118._4_4_ * auVar18._4_4_;
  auVar108._8_4_ = auVar118._8_4_ * auVar18._8_4_;
  auVar108._12_4_ = auVar118._12_4_ * auVar18._12_4_;
  auVar165 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar118 = vdpps_avx(auVar229,auVar229,0x7f);
  auVar86._0_4_ = fVar211 * auVar165._0_4_;
  auVar86._4_4_ = fVar101 * auVar165._4_4_;
  auVar86._8_4_ = fVar130 * auVar165._8_4_;
  auVar86._12_4_ = fVar131 * auVar165._12_4_;
  auVar175 = vsubps_avx(auVar108,auVar86);
  auVar18 = vshufps_avx(auVar143,auVar143,0xc9);
  fVar133 = auVar118._0_4_;
  auVar143 = ZEXT416((uint)fVar133);
  auVar165 = vrsqrtss_avx(auVar143,auVar143);
  fVar155 = auVar165._0_4_;
  auVar165 = vdpps_avx(auVar229,auVar18,0x7f);
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar87._0_4_ = auVar118._0_4_ * auVar18._0_4_;
  auVar87._4_4_ = auVar118._4_4_ * auVar18._4_4_;
  auVar87._8_4_ = auVar118._8_4_ * auVar18._8_4_;
  auVar87._12_4_ = auVar118._12_4_ * auVar18._12_4_;
  auVar118 = vshufps_avx(auVar165,auVar165,0);
  auVar218._0_4_ = auVar229._0_4_ * auVar118._0_4_;
  auVar218._4_4_ = auVar229._4_4_ * auVar118._4_4_;
  auVar218._8_4_ = auVar229._8_4_ * auVar118._8_4_;
  auVar218._12_4_ = auVar229._12_4_ * auVar118._12_4_;
  auVar77 = vsubps_avx(auVar87,auVar218);
  auVar118 = vrcpss_avx(auVar143,auVar143);
  auVar118 = ZEXT416((uint)(auVar118._0_4_ * (2.0 - fVar133 * auVar118._0_4_)));
  auVar18 = vshufps_avx(auVar118,auVar118,0);
  auVar143 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar118 = ZEXT416((uint)(fVar155 * 1.5 - fVar133 * 0.5 * fVar155 * fVar155 * fVar155));
  auVar19 = vshufps_avx(auVar118,auVar118,0);
  auVar165 = vdpps_avx(auVar143,auVar143,0x7f);
  fVar182 = auVar229._0_4_ * auVar19._0_4_;
  fVar183 = auVar229._4_4_ * auVar19._4_4_;
  fVar184 = auVar229._8_4_ * auVar19._8_4_;
  fVar212 = auVar229._12_4_ * auVar19._12_4_;
  auVar175 = vshufps_avx(auVar175,auVar175,0xc9);
  auVar118 = vblendps_avx(auVar165,_DAT_01feba10,0xe);
  auVar229 = vrsqrtss_avx(auVar118,auVar118);
  fVar133 = auVar229._0_4_;
  auVar229 = vdpps_avx(auVar143,auVar175,0x7f);
  auVar117 = vshufps_avx(auVar165,auVar165,0);
  auVar109._0_4_ = auVar117._0_4_ * auVar175._0_4_;
  auVar109._4_4_ = auVar117._4_4_ * auVar175._4_4_;
  auVar109._8_4_ = auVar117._8_4_ * auVar175._8_4_;
  auVar109._12_4_ = auVar117._12_4_ * auVar175._12_4_;
  auVar229 = vshufps_avx(auVar229,auVar229,0);
  auVar219._0_4_ = auVar143._0_4_ * auVar229._0_4_;
  auVar219._4_4_ = auVar143._4_4_ * auVar229._4_4_;
  auVar219._8_4_ = auVar143._8_4_ * auVar229._8_4_;
  auVar219._12_4_ = auVar143._12_4_ * auVar229._12_4_;
  auVar175 = vsubps_avx(auVar109,auVar219);
  auVar118 = vrcpss_avx(auVar118,auVar118);
  auVar118 = ZEXT416((uint)(auVar118._0_4_ * (2.0 - auVar165._0_4_ * auVar118._0_4_)));
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar165 = ZEXT416((uint)(fVar133 * 1.5 - auVar165._0_4_ * 0.5 * fVar133 * fVar133 * fVar133));
  auVar165 = vshufps_avx(auVar165,auVar165,0);
  fVar133 = auVar143._0_4_ * auVar165._0_4_;
  fVar155 = auVar143._4_4_ * auVar165._4_4_;
  fVar156 = auVar143._8_4_ * auVar165._8_4_;
  fVar157 = auVar143._12_4_ * auVar165._12_4_;
  auVar229 = vshufps_avx(auVar75,auVar75,0xff);
  auVar143 = vshufps_avx(auVar319,auVar319,0xff);
  auVar195._0_4_ = fVar182 * auVar143._0_4_;
  auVar195._4_4_ = fVar183 * auVar143._4_4_;
  auVar195._8_4_ = fVar184 * auVar143._8_4_;
  auVar195._12_4_ = fVar212 * auVar143._12_4_;
  auVar144._0_4_ =
       fVar182 * auVar229._0_4_ + auVar19._0_4_ * auVar77._0_4_ * auVar18._0_4_ * auVar143._0_4_;
  auVar144._4_4_ =
       fVar183 * auVar229._4_4_ + auVar19._4_4_ * auVar77._4_4_ * auVar18._4_4_ * auVar143._4_4_;
  auVar144._8_4_ =
       fVar184 * auVar229._8_4_ + auVar19._8_4_ * auVar77._8_4_ * auVar18._8_4_ * auVar143._8_4_;
  auVar144._12_4_ =
       fVar212 * auVar229._12_4_ +
       auVar19._12_4_ * auVar77._12_4_ * auVar18._12_4_ * auVar143._12_4_;
  auVar143 = vsubps_avx(auVar319,auVar195);
  auVar19 = vsubps_avx(auVar75,auVar144);
  auVar229 = vshufps_avx(auVar76,auVar76,0xff);
  auVar18 = vshufps_avx(_local_588,_local_588,0xff);
  auVar88._0_4_ = auVar18._0_4_ * fVar133;
  auVar88._4_4_ = auVar18._4_4_ * fVar155;
  auVar88._8_4_ = auVar18._8_4_ * fVar156;
  auVar88._12_4_ = auVar18._12_4_ * fVar157;
  auVar110._0_4_ =
       auVar229._0_4_ * fVar133 + auVar18._0_4_ * auVar165._0_4_ * auVar175._0_4_ * auVar118._0_4_;
  auVar110._4_4_ =
       auVar229._4_4_ * fVar155 + auVar18._4_4_ * auVar165._4_4_ * auVar175._4_4_ * auVar118._4_4_;
  auVar110._8_4_ =
       auVar229._8_4_ * fVar156 + auVar18._8_4_ * auVar165._8_4_ * auVar175._8_4_ * auVar118._8_4_;
  auVar110._12_4_ =
       auVar229._12_4_ * fVar157 +
       auVar18._12_4_ * auVar165._12_4_ * auVar175._12_4_ * auVar118._12_4_;
  auVar229 = vsubps_avx(_local_588,auVar88);
  auVar326._0_4_ = (float)local_588._0_4_ + auVar88._0_4_;
  auVar326._4_4_ = (float)local_588._4_4_ + auVar88._4_4_;
  auVar326._8_4_ = fStack_580 + auVar88._8_4_;
  auVar326._12_4_ = fStack_57c + auVar88._12_4_;
  auVar18 = vsubps_avx(auVar76,auVar110);
  local_478 = auVar91._0_4_;
  fStack_474 = auVar91._4_4_;
  fStack_470 = auVar91._8_4_;
  fStack_46c = auVar91._12_4_;
  local_5b8 = auVar147._0_4_;
  fStack_5b4 = auVar147._4_4_;
  fStack_5b0 = auVar147._8_4_;
  fStack_5ac = auVar147._12_4_;
  auVar118 = vshufps_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74),0);
  auVar165 = vshufps_avx(ZEXT416((uint)(1.0 - fVar74)),ZEXT416((uint)(1.0 - fVar74)),0);
  fVar157 = auVar118._0_4_;
  fVar182 = auVar118._4_4_;
  fVar183 = auVar118._8_4_;
  fVar184 = auVar118._12_4_;
  fVar74 = auVar165._0_4_;
  fVar133 = auVar165._4_4_;
  fVar155 = auVar165._8_4_;
  fVar156 = auVar165._12_4_;
  local_398._0_4_ = fVar74 * local_5b8 + fVar157 * auVar143._0_4_;
  local_398._4_4_ = fVar133 * fStack_5b4 + fVar182 * auVar143._4_4_;
  fStack_390 = fVar155 * fStack_5b0 + fVar183 * auVar143._8_4_;
  fStack_38c = fVar156 * fStack_5ac + fVar184 * auVar143._12_4_;
  fVar212 = fVar74 * (local_5b8 + local_478 * 0.33333334) +
            fVar157 * (auVar143._0_4_ + auVar19._0_4_ * 0.33333334);
  fVar231 = fVar133 * (fStack_5b4 + fStack_474 * 0.33333334) +
            fVar182 * (auVar143._4_4_ + auVar19._4_4_ * 0.33333334);
  fVar232 = fVar155 * (fStack_5b0 + fStack_470 * 0.33333334) +
            fVar183 * (auVar143._8_4_ + auVar19._8_4_ * 0.33333334);
  fVar233 = fVar156 * (fStack_5ac + fStack_46c * 0.33333334) +
            fVar184 * (auVar143._12_4_ + auVar19._12_4_ * 0.33333334);
  local_568 = auVar174._0_4_;
  fStack_564 = auVar174._4_4_;
  fStack_560 = auVar174._8_4_;
  fStack_55c = auVar174._12_4_;
  auVar166._0_4_ = local_568 * 0.33333334;
  auVar166._4_4_ = fStack_564 * 0.33333334;
  auVar166._8_4_ = fStack_560 * 0.33333334;
  auVar166._12_4_ = fStack_55c * 0.33333334;
  auVar118 = vsubps_avx(auVar20,auVar166);
  auVar220._0_4_ = (fVar324 + auVar83._0_4_) * 0.33333334;
  auVar220._4_4_ = (fVar331 + auVar83._4_4_) * 0.33333334;
  auVar220._8_4_ = (fVar332 + auVar83._8_4_) * 0.33333334;
  auVar220._12_4_ = (fVar333 + auVar83._12_4_) * 0.33333334;
  auVar165 = vsubps_avx(_local_538,auVar220);
  auVar145._0_4_ = auVar18._0_4_ * 0.33333334;
  auVar145._4_4_ = auVar18._4_4_ * 0.33333334;
  auVar145._8_4_ = auVar18._8_4_ * 0.33333334;
  auVar145._12_4_ = auVar18._12_4_ * 0.33333334;
  auVar18 = vsubps_avx(auVar229,auVar145);
  auVar111._0_4_ = (fVar211 + auVar110._0_4_) * 0.33333334;
  auVar111._4_4_ = (fVar101 + auVar110._4_4_) * 0.33333334;
  auVar111._8_4_ = (fVar130 + auVar110._8_4_) * 0.33333334;
  auVar111._12_4_ = (fVar131 + auVar110._12_4_) * 0.33333334;
  auVar143 = vsubps_avx(auVar326,auVar111);
  local_3a8._0_4_ = fVar74 * auVar118._0_4_ + fVar157 * auVar18._0_4_;
  local_3a8._4_4_ = fVar133 * auVar118._4_4_ + fVar182 * auVar18._4_4_;
  fStack_3a0 = fVar155 * auVar118._8_4_ + fVar183 * auVar18._8_4_;
  fStack_39c = fVar156 * auVar118._12_4_ + fVar184 * auVar18._12_4_;
  local_3b8._0_4_ = fVar157 * auVar229._0_4_ + auVar20._0_4_ * fVar74;
  local_3b8._4_4_ = fVar182 * auVar229._4_4_ + auVar20._4_4_ * fVar133;
  fStack_3b0 = fVar183 * auVar229._8_4_ + auVar20._8_4_ * fVar155;
  fStack_3ac = fVar184 * auVar229._12_4_ + auVar20._12_4_ * fVar156;
  local_3c8._0_4_ = fVar74 * (float)local_5e8._0_4_ + fVar157 * (auVar319._0_4_ + auVar195._0_4_);
  local_3c8._4_4_ = fVar133 * (float)local_5e8._4_4_ + fVar182 * (auVar319._4_4_ + auVar195._4_4_);
  fStack_3c0 = fVar155 * fStack_5e0 + fVar183 * (auVar319._8_4_ + auVar195._8_4_);
  fStack_3bc = fVar156 * fStack_5dc + fVar184 * (auVar319._12_4_ + auVar195._12_4_);
  local_3d8._0_4_ =
       fVar74 * ((float)local_5e8._0_4_ + (fVar73 + auVar251._0_4_) * 0.33333334) +
       fVar157 * (auVar319._0_4_ + auVar195._0_4_ + (fVar185 + auVar144._0_4_) * 0.33333334);
  local_3d8._4_4_ =
       fVar133 * ((float)local_5e8._4_4_ + (fVar98 + auVar251._4_4_) * 0.33333334) +
       fVar182 * (auVar319._4_4_ + auVar195._4_4_ + (fVar208 + auVar144._4_4_) * 0.33333334);
  fStack_3d0 = fVar155 * (fStack_5e0 + (fVar99 + auVar251._8_4_) * 0.33333334) +
               fVar183 * (auVar319._8_4_ + auVar195._8_4_ + (fVar209 + auVar144._8_4_) * 0.33333334)
  ;
  fStack_3cc = fVar156 * (fStack_5dc + (fVar100 + auVar251._12_4_) * 0.33333334) +
               fVar184 * (auVar319._12_4_ + auVar195._12_4_ +
                         (fVar210 + auVar144._12_4_) * 0.33333334);
  local_3e8._0_4_ = fVar74 * auVar165._0_4_ + fVar157 * auVar143._0_4_;
  local_3e8._4_4_ = fVar133 * auVar165._4_4_ + fVar182 * auVar143._4_4_;
  fStack_3e0 = fVar155 * auVar165._8_4_ + fVar183 * auVar143._8_4_;
  fStack_3dc = fVar156 * auVar165._12_4_ + fVar184 * auVar143._12_4_;
  auVar118 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar118 = vinsertps_avx(auVar118,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_3f8 = (auVar237._0_4_ + auVar138._0_4_) * fVar74 + fVar157 * auVar326._0_4_;
  fStack_3f4 = (auVar237._4_4_ + auVar138._4_4_) * fVar133 + fVar182 * auVar326._4_4_;
  fStack_3f0 = (auVar237._8_4_ + auVar138._8_4_) * fVar155 + fVar183 * auVar326._8_4_;
  fStack_3ec = (auVar237._12_4_ + auVar138._12_4_) * fVar156 + fVar184 * auVar326._12_4_;
  local_268 = vsubps_avx(_local_398,auVar118);
  auVar229 = vmovsldup_avx(local_268);
  auVar165 = vmovshdup_avx(local_268);
  auVar18 = vshufps_avx(local_268,local_268,0xaa);
  fVar74 = pre->ray_space[k].vx.field_0.m128[0];
  fVar133 = pre->ray_space[k].vx.field_0.m128[1];
  fVar155 = pre->ray_space[k].vx.field_0.m128[2];
  fVar156 = pre->ray_space[k].vx.field_0.m128[3];
  fVar157 = pre->ray_space[k].vy.field_0.m128[0];
  fVar182 = pre->ray_space[k].vy.field_0.m128[1];
  fVar183 = pre->ray_space[k].vy.field_0.m128[2];
  fVar184 = pre->ray_space[k].vy.field_0.m128[3];
  fVar185 = pre->ray_space[k].vz.field_0.m128[0];
  fVar208 = pre->ray_space[k].vz.field_0.m128[1];
  fVar209 = pre->ray_space[k].vz.field_0.m128[2];
  fVar210 = pre->ray_space[k].vz.field_0.m128[3];
  local_4f8._0_4_ = fVar74 * auVar229._0_4_ + fVar157 * auVar165._0_4_ + fVar185 * auVar18._0_4_;
  local_4f8._4_4_ = fVar133 * auVar229._4_4_ + fVar182 * auVar165._4_4_ + fVar208 * auVar18._4_4_;
  fStack_4f0 = fVar155 * auVar229._8_4_ + fVar183 * auVar165._8_4_ + fVar209 * auVar18._8_4_;
  fStack_4ec = fVar156 * auVar229._12_4_ + fVar184 * auVar165._12_4_ + fVar210 * auVar18._12_4_;
  auVar60._4_4_ = fVar231;
  auVar60._0_4_ = fVar212;
  auVar60._8_4_ = fVar232;
  auVar60._12_4_ = fVar233;
  local_278 = vsubps_avx(auVar60,auVar118);
  auVar18 = vshufps_avx(local_278,local_278,0xaa);
  auVar165 = vmovshdup_avx(local_278);
  auVar229 = vmovsldup_avx(local_278);
  local_5e8._4_4_ = fVar133 * auVar229._4_4_ + fVar182 * auVar165._4_4_ + fVar208 * auVar18._4_4_;
  local_5e8._0_4_ = fVar74 * auVar229._0_4_ + fVar157 * auVar165._0_4_ + fVar185 * auVar18._0_4_;
  fStack_5e0 = fVar155 * auVar229._8_4_ + fVar183 * auVar165._8_4_ + fVar209 * auVar18._8_4_;
  fStack_5dc = fVar156 * auVar229._12_4_ + fVar184 * auVar165._12_4_ + fVar210 * auVar18._12_4_;
  local_288 = vsubps_avx(_local_3a8,auVar118);
  auVar18 = vshufps_avx(local_288,local_288,0xaa);
  auVar165 = vmovshdup_avx(local_288);
  auVar229 = vmovsldup_avx(local_288);
  auVar196._0_4_ = fVar74 * auVar229._0_4_ + fVar157 * auVar165._0_4_ + fVar185 * auVar18._0_4_;
  auVar196._4_4_ = fVar133 * auVar229._4_4_ + fVar182 * auVar165._4_4_ + fVar208 * auVar18._4_4_;
  auVar196._8_4_ = fVar155 * auVar229._8_4_ + fVar183 * auVar165._8_4_ + fVar209 * auVar18._8_4_;
  auVar196._12_4_ = fVar156 * auVar229._12_4_ + fVar184 * auVar165._12_4_ + fVar210 * auVar18._12_4_
  ;
  local_298 = vsubps_avx(_local_3b8,auVar118);
  auVar18 = vshufps_avx(local_298,local_298,0xaa);
  auVar165 = vmovshdup_avx(local_298);
  auVar229 = vmovsldup_avx(local_298);
  auVar112._0_4_ = auVar229._0_4_ * fVar74 + auVar165._0_4_ * fVar157 + fVar185 * auVar18._0_4_;
  auVar112._4_4_ = auVar229._4_4_ * fVar133 + auVar165._4_4_ * fVar182 + fVar208 * auVar18._4_4_;
  auVar112._8_4_ = auVar229._8_4_ * fVar155 + auVar165._8_4_ * fVar183 + fVar209 * auVar18._8_4_;
  auVar112._12_4_ = auVar229._12_4_ * fVar156 + auVar165._12_4_ * fVar184 + fVar210 * auVar18._12_4_
  ;
  local_2a8 = vsubps_avx(_local_3c8,auVar118);
  auVar18 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar165 = vmovshdup_avx(local_2a8);
  auVar229 = vmovsldup_avx(local_2a8);
  auVar270._0_4_ = auVar229._0_4_ * fVar74 + auVar165._0_4_ * fVar157 + auVar18._0_4_ * fVar185;
  auVar270._4_4_ = auVar229._4_4_ * fVar133 + auVar165._4_4_ * fVar182 + auVar18._4_4_ * fVar208;
  auVar270._8_4_ = auVar229._8_4_ * fVar155 + auVar165._8_4_ * fVar183 + auVar18._8_4_ * fVar209;
  auVar270._12_4_ = auVar229._12_4_ * fVar156 + auVar165._12_4_ * fVar184 + auVar18._12_4_ * fVar210
  ;
  local_2b8 = vsubps_avx(_local_3d8,auVar118);
  auVar18 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar165 = vmovshdup_avx(local_2b8);
  auVar229 = vmovsldup_avx(local_2b8);
  auVar281._0_4_ = auVar229._0_4_ * fVar74 + auVar165._0_4_ * fVar157 + auVar18._0_4_ * fVar185;
  auVar281._4_4_ = auVar229._4_4_ * fVar133 + auVar165._4_4_ * fVar182 + auVar18._4_4_ * fVar208;
  auVar281._8_4_ = auVar229._8_4_ * fVar155 + auVar165._8_4_ * fVar183 + auVar18._8_4_ * fVar209;
  auVar281._12_4_ = auVar229._12_4_ * fVar156 + auVar165._12_4_ * fVar184 + auVar18._12_4_ * fVar210
  ;
  local_2c8 = vsubps_avx(_local_3e8,auVar118);
  auVar18 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar165 = vmovshdup_avx(local_2c8);
  auVar229 = vmovsldup_avx(local_2c8);
  auVar297._0_4_ = auVar229._0_4_ * fVar74 + auVar165._0_4_ * fVar157 + auVar18._0_4_ * fVar185;
  auVar297._4_4_ = auVar229._4_4_ * fVar133 + auVar165._4_4_ * fVar182 + auVar18._4_4_ * fVar208;
  auVar297._8_4_ = auVar229._8_4_ * fVar155 + auVar165._8_4_ * fVar183 + auVar18._8_4_ * fVar209;
  auVar297._12_4_ = auVar229._12_4_ * fVar156 + auVar165._12_4_ * fVar184 + auVar18._12_4_ * fVar210
  ;
  auVar64._4_4_ = fStack_3f4;
  auVar64._0_4_ = local_3f8;
  auVar64._8_4_ = fStack_3f0;
  auVar64._12_4_ = fStack_3ec;
  local_2d8 = vsubps_avx(auVar64,auVar118);
  auVar229 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar118 = vmovshdup_avx(local_2d8);
  auVar165 = vmovsldup_avx(local_2d8);
  auVar89._0_4_ = fVar74 * auVar165._0_4_ + fVar157 * auVar118._0_4_ + fVar185 * auVar229._0_4_;
  auVar89._4_4_ = fVar133 * auVar165._4_4_ + fVar182 * auVar118._4_4_ + fVar208 * auVar229._4_4_;
  auVar89._8_4_ = fVar155 * auVar165._8_4_ + fVar183 * auVar118._8_4_ + fVar209 * auVar229._8_4_;
  auVar89._12_4_ = fVar156 * auVar165._12_4_ + fVar184 * auVar118._12_4_ + fVar210 * auVar229._12_4_
  ;
  auVar18 = vmovlhps_avx(_local_4f8,auVar270);
  auVar143 = vmovlhps_avx(_local_5e8,auVar281);
  auVar19 = vmovlhps_avx(auVar196,auVar297);
  _local_388 = vmovlhps_avx(auVar112,auVar89);
  auVar118 = vminps_avx(auVar18,auVar143);
  auVar165 = vminps_avx(auVar19,_local_388);
  auVar229 = vminps_avx(auVar118,auVar165);
  auVar118 = vmaxps_avx(auVar18,auVar143);
  auVar165 = vmaxps_avx(auVar19,_local_388);
  auVar118 = vmaxps_avx(auVar118,auVar165);
  auVar165 = vshufpd_avx(auVar229,auVar229,3);
  auVar229 = vminps_avx(auVar229,auVar165);
  auVar165 = vshufpd_avx(auVar118,auVar118,3);
  auVar165 = vmaxps_avx(auVar118,auVar165);
  auVar238._8_4_ = 0x7fffffff;
  auVar238._0_8_ = 0x7fffffff7fffffff;
  auVar238._12_4_ = 0x7fffffff;
  auVar118 = vandps_avx(auVar229,auVar238);
  auVar165 = vandps_avx(auVar165,auVar238);
  auVar118 = vmaxps_avx(auVar118,auVar165);
  auVar165 = vmovshdup_avx(auVar118);
  auVar118 = vmaxss_avx(auVar165,auVar118);
  local_430 = (ulong)uVar65 + 0xf;
  fVar133 = auVar118._0_4_ * 9.536743e-07;
  register0x00001548 = local_5e8;
  local_378 = local_5e8;
  auVar118 = vshufps_avx(ZEXT416((uint)fVar133),ZEXT416((uint)fVar133),0);
  local_138._16_16_ = auVar118;
  local_138._0_16_ = auVar118;
  auVar90._0_8_ = auVar118._0_8_ ^ 0x8000000080000000;
  auVar90._8_4_ = auVar118._8_4_ ^ 0x80000000;
  auVar90._12_4_ = auVar118._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar90;
  local_158._0_16_ = auVar90;
  local_348 = vpshufd_avx(ZEXT416(uVar67),0);
  local_358 = vpshufd_avx(ZEXT416(*(uint *)(local_440 + lVar69 * 4 + 6)),0);
  uVar72 = 0;
  fVar74 = *(float *)(ray + k * 4 + 0x30);
  _local_238 = vsubps_avx(auVar143,auVar18);
  _local_248 = vsubps_avx(auVar19,auVar143);
  _local_258 = vsubps_avx(_local_388,auVar19);
  _local_2f8 = vsubps_avx(_local_3c8,_local_398);
  auVar61._4_4_ = fVar231;
  auVar61._0_4_ = fVar212;
  auVar61._8_4_ = fVar232;
  auVar61._12_4_ = fVar233;
  _local_308 = vsubps_avx(_local_3d8,auVar61);
  _local_318 = vsubps_avx(_local_3e8,_local_3a8);
  _local_328 = vsubps_avx(auVar64,_local_3b8);
  _local_5e8 = ZEXT816(0x3f80000000000000);
  local_2e8 = _local_5e8;
  do {
    auVar118 = vshufps_avx(_local_5e8,_local_5e8,0x50);
    auVar347._8_4_ = 0x3f800000;
    auVar347._0_8_ = &DAT_3f8000003f800000;
    auVar347._12_4_ = 0x3f800000;
    auVar350._16_4_ = 0x3f800000;
    auVar350._0_16_ = auVar347;
    auVar350._20_4_ = 0x3f800000;
    auVar350._24_4_ = 0x3f800000;
    auVar350._28_4_ = 0x3f800000;
    auVar165 = vsubps_avx(auVar347,auVar118);
    fVar155 = auVar118._0_4_;
    fVar156 = auVar118._4_4_;
    fVar157 = auVar118._8_4_;
    fVar182 = auVar118._12_4_;
    fVar183 = auVar165._0_4_;
    fVar184 = auVar165._4_4_;
    fVar185 = auVar165._8_4_;
    fVar208 = auVar165._12_4_;
    auVar146._0_4_ = auVar270._0_4_ * fVar155 + fVar183 * (float)local_4f8._0_4_;
    auVar146._4_4_ = auVar270._4_4_ * fVar156 + fVar184 * (float)local_4f8._4_4_;
    auVar146._8_4_ = auVar270._0_4_ * fVar157 + fVar185 * (float)local_4f8._0_4_;
    auVar146._12_4_ = auVar270._4_4_ * fVar182 + fVar208 * (float)local_4f8._4_4_;
    auVar113._0_4_ = auVar281._0_4_ * fVar155 + local_378._0_4_ * fVar183;
    auVar113._4_4_ = auVar281._4_4_ * fVar156 + local_378._4_4_ * fVar184;
    auVar113._8_4_ = auVar281._0_4_ * fVar157 + local_378._8_4_ * fVar185;
    auVar113._12_4_ = auVar281._4_4_ * fVar182 + local_378._12_4_ * fVar208;
    auVar252._0_4_ = auVar297._0_4_ * fVar155 + auVar196._0_4_ * fVar183;
    auVar252._4_4_ = auVar297._4_4_ * fVar156 + auVar196._4_4_ * fVar184;
    auVar252._8_4_ = auVar297._0_4_ * fVar157 + auVar196._0_4_ * fVar185;
    auVar252._12_4_ = auVar297._4_4_ * fVar182 + auVar196._4_4_ * fVar208;
    auVar167._0_4_ = auVar89._0_4_ * fVar155 + auVar112._0_4_ * fVar183;
    auVar167._4_4_ = auVar89._4_4_ * fVar156 + auVar112._4_4_ * fVar184;
    auVar167._8_4_ = auVar89._0_4_ * fVar157 + auVar112._0_4_ * fVar185;
    auVar167._12_4_ = auVar89._4_4_ * fVar182 + auVar112._4_4_ * fVar208;
    auVar118 = vmovshdup_avx(local_2e8);
    auVar165 = vshufps_avx(local_2e8,local_2e8,0);
    auVar277._16_16_ = auVar165;
    auVar277._0_16_ = auVar165;
    auVar229 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar95._16_16_ = auVar229;
    auVar95._0_16_ = auVar229;
    auVar94 = vsubps_avx(auVar95,auVar277);
    auVar229 = vshufps_avx(auVar146,auVar146,0);
    auVar175 = vshufps_avx(auVar146,auVar146,0x55);
    auVar117 = vshufps_avx(auVar113,auVar113,0);
    auVar174 = vshufps_avx(auVar113,auVar113,0x55);
    auVar91 = vshufps_avx(auVar252,auVar252,0);
    auVar147 = vshufps_avx(auVar252,auVar252,0x55);
    auVar20 = vshufps_avx(auVar167,auVar167,0);
    auVar75 = vshufps_avx(auVar167,auVar167,0x55);
    auVar118 = ZEXT416((uint)((auVar118._0_4_ - local_2e8._0_4_) * 0.04761905));
    auVar118 = vshufps_avx(auVar118,auVar118,0);
    auVar291._0_4_ = auVar165._0_4_ + auVar94._0_4_ * 0.0;
    auVar291._4_4_ = auVar165._4_4_ + auVar94._4_4_ * 0.14285715;
    auVar291._8_4_ = auVar165._8_4_ + auVar94._8_4_ * 0.2857143;
    auVar291._12_4_ = auVar165._12_4_ + auVar94._12_4_ * 0.42857146;
    auVar291._16_4_ = auVar165._0_4_ + auVar94._16_4_ * 0.5714286;
    auVar291._20_4_ = auVar165._4_4_ + auVar94._20_4_ * 0.71428573;
    auVar291._24_4_ = auVar165._8_4_ + auVar94._24_4_ * 0.8571429;
    auVar291._28_4_ = auVar165._12_4_ + auVar94._28_4_;
    auVar23 = vsubps_avx(auVar350,auVar291);
    fVar99 = auVar117._0_4_;
    fVar101 = auVar117._4_4_;
    fVar292 = auVar117._8_4_;
    fVar294 = auVar117._12_4_;
    fVar155 = auVar23._0_4_;
    fVar183 = auVar23._4_4_;
    fVar209 = auVar23._8_4_;
    fVar98 = auVar23._12_4_;
    fVar334 = auVar229._12_4_;
    fVar130 = auVar23._16_4_;
    fVar131 = auVar23._20_4_;
    fVar132 = auVar23._24_4_;
    fVar324 = auVar174._0_4_;
    fVar332 = auVar174._4_4_;
    fVar304 = auVar174._8_4_;
    fVar352 = auVar174._12_4_;
    local_518 = auVar175._0_4_;
    fStack_514 = auVar175._4_4_;
    fStack_510 = auVar175._8_4_;
    fStack_50c = auVar175._12_4_;
    fVar156 = auVar91._0_4_;
    fVar182 = auVar91._4_4_;
    fVar185 = auVar91._8_4_;
    fVar210 = auVar91._12_4_;
    fVar100 = auVar291._0_4_ * fVar156 + fVar99 * fVar155;
    fVar279 = auVar291._4_4_ * fVar182 + fVar101 * fVar183;
    fVar293 = auVar291._8_4_ * fVar185 + fVar292 * fVar209;
    fVar303 = auVar291._12_4_ * fVar210 + fVar294 * fVar98;
    fVar311 = auVar291._16_4_ * fVar156 + fVar99 * fVar130;
    fVar313 = auVar291._20_4_ * fVar182 + fVar101 * fVar131;
    fVar315 = auVar291._24_4_ * fVar185 + fVar292 * fVar132;
    fVar157 = auVar147._0_4_;
    fVar184 = auVar147._4_4_;
    fVar208 = auVar147._8_4_;
    fVar211 = auVar147._12_4_;
    fVar331 = auVar291._0_4_ * fVar157 + fVar324 * fVar155;
    fVar333 = auVar291._4_4_ * fVar184 + fVar332 * fVar183;
    fVar312 = auVar291._8_4_ * fVar208 + fVar304 * fVar209;
    fVar314 = auVar291._12_4_ * fVar211 + fVar352 * fVar98;
    fVar316 = auVar291._16_4_ * fVar157 + fVar324 * fVar130;
    fVar345 = auVar291._20_4_ * fVar184 + fVar332 * fVar131;
    fVar353 = auVar291._24_4_ * fVar208 + fVar304 * fVar132;
    auVar165 = vshufps_avx(auVar146,auVar146,0xaa);
    auVar175 = vshufps_avx(auVar146,auVar146,0xff);
    fVar73 = fVar210 + 0.0;
    auVar117 = vshufps_avx(auVar113,auVar113,0xaa);
    auVar174 = vshufps_avx(auVar113,auVar113,0xff);
    auVar96._0_4_ =
         fVar155 * (fVar99 * auVar291._0_4_ + auVar229._0_4_ * fVar155) + auVar291._0_4_ * fVar100;
    auVar96._4_4_ =
         fVar183 * (fVar101 * auVar291._4_4_ + auVar229._4_4_ * fVar183) + auVar291._4_4_ * fVar279;
    auVar96._8_4_ =
         fVar209 * (fVar292 * auVar291._8_4_ + auVar229._8_4_ * fVar209) + auVar291._8_4_ * fVar293;
    auVar96._12_4_ =
         fVar98 * (fVar294 * auVar291._12_4_ + fVar334 * fVar98) + auVar291._12_4_ * fVar303;
    auVar96._16_4_ =
         fVar130 * (fVar99 * auVar291._16_4_ + auVar229._0_4_ * fVar130) + auVar291._16_4_ * fVar311
    ;
    auVar96._20_4_ =
         fVar131 * (fVar101 * auVar291._20_4_ + auVar229._4_4_ * fVar131) +
         auVar291._20_4_ * fVar313;
    auVar96._24_4_ =
         fVar132 * (fVar292 * auVar291._24_4_ + auVar229._8_4_ * fVar132) +
         auVar291._24_4_ * fVar315;
    auVar96._28_4_ = fVar334 + 1.0 + fVar211;
    auVar178._0_4_ =
         fVar155 * (fVar324 * auVar291._0_4_ + fVar155 * local_518) + auVar291._0_4_ * fVar331;
    auVar178._4_4_ =
         fVar183 * (fVar332 * auVar291._4_4_ + fVar183 * fStack_514) + auVar291._4_4_ * fVar333;
    auVar178._8_4_ =
         fVar209 * (fVar304 * auVar291._8_4_ + fVar209 * fStack_510) + auVar291._8_4_ * fVar312;
    auVar178._12_4_ =
         fVar98 * (fVar352 * auVar291._12_4_ + fVar98 * fStack_50c) + auVar291._12_4_ * fVar314;
    auVar178._16_4_ =
         fVar130 * (fVar324 * auVar291._16_4_ + fVar130 * local_518) + auVar291._16_4_ * fVar316;
    auVar178._20_4_ =
         fVar131 * (fVar332 * auVar291._20_4_ + fVar131 * fStack_514) + auVar291._20_4_ * fVar345;
    auVar178._24_4_ =
         fVar132 * (fVar304 * auVar291._24_4_ + fVar132 * fStack_510) + auVar291._24_4_ * fVar353;
    auVar178._28_4_ = fVar334 + 1.0 + fVar211;
    auVar205._0_4_ =
         fVar155 * fVar100 + auVar291._0_4_ * (auVar20._0_4_ * auVar291._0_4_ + fVar155 * fVar156);
    auVar205._4_4_ =
         fVar183 * fVar279 + auVar291._4_4_ * (auVar20._4_4_ * auVar291._4_4_ + fVar183 * fVar182);
    auVar205._8_4_ =
         fVar209 * fVar293 + auVar291._8_4_ * (auVar20._8_4_ * auVar291._8_4_ + fVar209 * fVar185);
    auVar205._12_4_ =
         fVar98 * fVar303 + auVar291._12_4_ * (auVar20._12_4_ * auVar291._12_4_ + fVar98 * fVar210);
    auVar205._16_4_ =
         fVar130 * fVar311 + auVar291._16_4_ * (auVar20._0_4_ * auVar291._16_4_ + fVar130 * fVar156)
    ;
    auVar205._20_4_ =
         fVar131 * fVar313 + auVar291._20_4_ * (auVar20._4_4_ * auVar291._20_4_ + fVar131 * fVar182)
    ;
    auVar205._24_4_ =
         fVar132 * fVar315 + auVar291._24_4_ * (auVar20._8_4_ * auVar291._24_4_ + fVar132 * fVar185)
    ;
    auVar205._28_4_ = fVar211 + fVar73;
    auVar302._0_4_ =
         fVar155 * fVar331 + auVar291._0_4_ * (auVar75._0_4_ * auVar291._0_4_ + fVar155 * fVar157);
    auVar302._4_4_ =
         fVar183 * fVar333 + auVar291._4_4_ * (auVar75._4_4_ * auVar291._4_4_ + fVar183 * fVar184);
    auVar302._8_4_ =
         fVar209 * fVar312 + auVar291._8_4_ * (auVar75._8_4_ * auVar291._8_4_ + fVar209 * fVar208);
    auVar302._12_4_ =
         fVar98 * fVar314 + auVar291._12_4_ * (auVar75._12_4_ * auVar291._12_4_ + fVar98 * fVar211);
    auVar302._16_4_ =
         fVar130 * fVar316 + auVar291._16_4_ * (auVar75._0_4_ * auVar291._16_4_ + fVar130 * fVar157)
    ;
    auVar302._20_4_ =
         fVar131 * fVar345 + auVar291._20_4_ * (auVar75._4_4_ * auVar291._20_4_ + fVar131 * fVar184)
    ;
    auVar302._24_4_ =
         fVar132 * fVar353 + auVar291._24_4_ * (auVar75._8_4_ * auVar291._24_4_ + fVar132 * fVar208)
    ;
    auVar302._28_4_ = fVar73 + fVar211 + 0.0;
    local_78._0_4_ = fVar155 * auVar96._0_4_ + auVar291._0_4_ * auVar205._0_4_;
    local_78._4_4_ = fVar183 * auVar96._4_4_ + auVar291._4_4_ * auVar205._4_4_;
    local_78._8_4_ = fVar209 * auVar96._8_4_ + auVar291._8_4_ * auVar205._8_4_;
    local_78._12_4_ = fVar98 * auVar96._12_4_ + auVar291._12_4_ * auVar205._12_4_;
    local_78._16_4_ = fVar130 * auVar96._16_4_ + auVar291._16_4_ * auVar205._16_4_;
    local_78._20_4_ = fVar131 * auVar96._20_4_ + auVar291._20_4_ * auVar205._20_4_;
    local_78._24_4_ = fVar132 * auVar96._24_4_ + auVar291._24_4_ * auVar205._24_4_;
    local_78._28_4_ = fVar334 + fVar294 + fVar211 + 0.0;
    local_98._0_4_ = fVar155 * auVar178._0_4_ + auVar291._0_4_ * auVar302._0_4_;
    local_98._4_4_ = fVar183 * auVar178._4_4_ + auVar291._4_4_ * auVar302._4_4_;
    local_98._8_4_ = fVar209 * auVar178._8_4_ + auVar291._8_4_ * auVar302._8_4_;
    local_98._12_4_ = fVar98 * auVar178._12_4_ + auVar291._12_4_ * auVar302._12_4_;
    local_98._16_4_ = fVar130 * auVar178._16_4_ + auVar291._16_4_ * auVar302._16_4_;
    local_98._20_4_ = fVar131 * auVar178._20_4_ + auVar291._20_4_ * auVar302._20_4_;
    local_98._24_4_ = fVar132 * auVar178._24_4_ + auVar291._24_4_ * auVar302._24_4_;
    local_98._28_4_ = fVar334 + fVar294 + fVar73;
    auVar24 = vsubps_avx(auVar205,auVar96);
    auVar94 = vsubps_avx(auVar302,auVar178);
    local_588._0_4_ = auVar118._0_4_;
    local_588._4_4_ = auVar118._4_4_;
    fStack_580 = auVar118._8_4_;
    fStack_57c = auVar118._12_4_;
    local_d8 = (float)local_588._0_4_ * auVar24._0_4_ * 3.0;
    fStack_d4 = (float)local_588._4_4_ * auVar24._4_4_ * 3.0;
    auVar25._4_4_ = fStack_d4;
    auVar25._0_4_ = local_d8;
    fStack_d0 = fStack_580 * auVar24._8_4_ * 3.0;
    auVar25._8_4_ = fStack_d0;
    fStack_cc = fStack_57c * auVar24._12_4_ * 3.0;
    auVar25._12_4_ = fStack_cc;
    fStack_c8 = (float)local_588._0_4_ * auVar24._16_4_ * 3.0;
    auVar25._16_4_ = fStack_c8;
    fStack_c4 = (float)local_588._4_4_ * auVar24._20_4_ * 3.0;
    auVar25._20_4_ = fStack_c4;
    fStack_c0 = fStack_580 * auVar24._24_4_ * 3.0;
    auVar25._24_4_ = fStack_c0;
    auVar25._28_4_ = auVar24._28_4_;
    fVar279 = (float)local_588._0_4_ * auVar94._0_4_ * 3.0;
    fVar292 = (float)local_588._4_4_ * auVar94._4_4_ * 3.0;
    auVar26._4_4_ = fVar292;
    auVar26._0_4_ = fVar279;
    fVar293 = fStack_580 * auVar94._8_4_ * 3.0;
    auVar26._8_4_ = fVar293;
    fVar294 = fStack_57c * auVar94._12_4_ * 3.0;
    auVar26._12_4_ = fVar294;
    fVar303 = (float)local_588._0_4_ * auVar94._16_4_ * 3.0;
    auVar26._16_4_ = fVar303;
    fVar311 = (float)local_588._4_4_ * auVar94._20_4_ * 3.0;
    auVar26._20_4_ = fVar311;
    fVar313 = fStack_580 * auVar94._24_4_ * 3.0;
    auVar26._24_4_ = fVar313;
    auVar26._28_4_ = auVar205._28_4_;
    auVar25 = vsubps_avx(local_78,auVar25);
    auVar94 = vperm2f128_avx(auVar25,auVar25,1);
    auVar94 = vshufps_avx(auVar94,auVar25,0x30);
    auVar94 = vshufps_avx(auVar25,auVar94,0x29);
    auVar26 = vsubps_avx(local_98,auVar26);
    auVar25 = vperm2f128_avx(auVar26,auVar26,1);
    auVar25 = vshufps_avx(auVar25,auVar26,0x30);
    auVar95 = vshufps_avx(auVar26,auVar25,0x29);
    fVar336 = auVar117._0_4_;
    fVar343 = auVar117._4_4_;
    fVar344 = auVar117._8_4_;
    fVar156 = auVar174._0_4_;
    fVar184 = auVar174._4_4_;
    fVar210 = auVar174._8_4_;
    fVar99 = auVar174._12_4_;
    fVar335 = auVar175._12_4_;
    auVar118 = vshufps_avx(auVar252,auVar252,0xaa);
    fVar157 = auVar118._0_4_;
    fVar185 = auVar118._4_4_;
    fVar211 = auVar118._8_4_;
    fVar100 = auVar118._12_4_;
    fVar314 = auVar291._0_4_ * fVar157 + fVar336 * fVar155;
    fVar316 = auVar291._4_4_ * fVar185 + fVar343 * fVar183;
    fVar345 = auVar291._8_4_ * fVar211 + fVar344 * fVar209;
    fVar353 = auVar291._12_4_ * fVar100 + auVar117._12_4_ * fVar98;
    fVar354 = auVar291._16_4_ * fVar157 + fVar336 * fVar130;
    fVar322 = auVar291._20_4_ * fVar185 + fVar343 * fVar131;
    fVar323 = auVar291._24_4_ * fVar211 + fVar344 * fVar132;
    fVar352 = fVar335 + fVar334 + fVar352;
    auVar118 = vshufps_avx(auVar252,auVar252,0xff);
    fVar182 = auVar118._0_4_;
    fVar208 = auVar118._4_4_;
    fVar73 = auVar118._8_4_;
    fVar101 = auVar118._12_4_;
    fVar315 = auVar291._0_4_ * fVar182 + fVar155 * fVar156;
    fVar324 = auVar291._4_4_ * fVar208 + fVar183 * fVar184;
    fVar331 = auVar291._8_4_ * fVar73 + fVar209 * fVar210;
    fVar332 = auVar291._12_4_ * fVar101 + fVar98 * fVar99;
    fVar333 = auVar291._16_4_ * fVar182 + fVar130 * fVar156;
    fVar304 = auVar291._20_4_ * fVar208 + fVar131 * fVar184;
    fVar312 = auVar291._24_4_ * fVar73 + fVar132 * fVar210;
    auVar118 = vshufps_avx(auVar167,auVar167,0xaa);
    auVar229 = vshufps_avx(auVar167,auVar167,0xff);
    fVar334 = auVar229._12_4_;
    auVar97._0_4_ =
         auVar291._0_4_ * fVar314 + fVar155 * (fVar336 * auVar291._0_4_ + auVar165._0_4_ * fVar155);
    auVar97._4_4_ =
         auVar291._4_4_ * fVar316 + fVar183 * (fVar343 * auVar291._4_4_ + auVar165._4_4_ * fVar183);
    auVar97._8_4_ =
         auVar291._8_4_ * fVar345 + fVar209 * (fVar344 * auVar291._8_4_ + auVar165._8_4_ * fVar209);
    auVar97._12_4_ =
         auVar291._12_4_ * fVar353 +
         fVar98 * (auVar117._12_4_ * auVar291._12_4_ + auVar165._12_4_ * fVar98);
    auVar97._16_4_ =
         auVar291._16_4_ * fVar354 +
         fVar130 * (fVar336 * auVar291._16_4_ + auVar165._0_4_ * fVar130);
    auVar97._20_4_ =
         auVar291._20_4_ * fVar322 +
         fVar131 * (fVar343 * auVar291._20_4_ + auVar165._4_4_ * fVar131);
    auVar97._24_4_ =
         auVar291._24_4_ * fVar323 +
         fVar132 * (fVar344 * auVar291._24_4_ + auVar165._8_4_ * fVar132);
    auVar97._28_4_ = fVar334 + auVar26._28_4_ + auVar25._28_4_;
    auVar330._0_4_ =
         auVar291._0_4_ * fVar315 + fVar155 * (auVar291._0_4_ * fVar156 + auVar175._0_4_ * fVar155);
    auVar330._4_4_ =
         auVar291._4_4_ * fVar324 + fVar183 * (auVar291._4_4_ * fVar184 + auVar175._4_4_ * fVar183);
    auVar330._8_4_ =
         auVar291._8_4_ * fVar331 + fVar209 * (auVar291._8_4_ * fVar210 + auVar175._8_4_ * fVar209);
    auVar330._12_4_ =
         auVar291._12_4_ * fVar332 + fVar98 * (auVar291._12_4_ * fVar99 + fVar335 * fVar98);
    auVar330._16_4_ =
         auVar291._16_4_ * fVar333 +
         fVar130 * (auVar291._16_4_ * fVar156 + auVar175._0_4_ * fVar130);
    auVar330._20_4_ =
         auVar291._20_4_ * fVar304 +
         fVar131 * (auVar291._20_4_ * fVar184 + auVar175._4_4_ * fVar131);
    auVar330._24_4_ =
         auVar291._24_4_ * fVar312 +
         fVar132 * (auVar291._24_4_ * fVar210 + auVar175._8_4_ * fVar132);
    auVar330._28_4_ = fVar334 + auVar25._28_4_ + auVar205._28_4_;
    auVar25 = vperm2f128_avx(local_78,local_78,1);
    auVar25 = vshufps_avx(auVar25,local_78,0x30);
    auVar96 = vshufps_avx(local_78,auVar25,0x29);
    auVar206._0_4_ =
         fVar155 * fVar314 + auVar291._0_4_ * (auVar118._0_4_ * auVar291._0_4_ + fVar155 * fVar157);
    auVar206._4_4_ =
         fVar183 * fVar316 + auVar291._4_4_ * (auVar118._4_4_ * auVar291._4_4_ + fVar183 * fVar185);
    auVar206._8_4_ =
         fVar209 * fVar345 + auVar291._8_4_ * (auVar118._8_4_ * auVar291._8_4_ + fVar209 * fVar211);
    auVar206._12_4_ =
         fVar98 * fVar353 + auVar291._12_4_ * (auVar118._12_4_ * auVar291._12_4_ + fVar98 * fVar100)
    ;
    auVar206._16_4_ =
         fVar130 * fVar354 +
         auVar291._16_4_ * (auVar118._0_4_ * auVar291._16_4_ + fVar130 * fVar157);
    auVar206._20_4_ =
         fVar131 * fVar322 +
         auVar291._20_4_ * (auVar118._4_4_ * auVar291._20_4_ + fVar131 * fVar185);
    auVar206._24_4_ =
         fVar132 * fVar323 +
         auVar291._24_4_ * (auVar118._8_4_ * auVar291._24_4_ + fVar132 * fVar211);
    auVar206._28_4_ = fVar352 + auVar118._12_4_ + fVar100;
    auVar244._0_4_ =
         fVar155 * fVar315 + auVar291._0_4_ * (auVar229._0_4_ * auVar291._0_4_ + fVar155 * fVar182);
    auVar244._4_4_ =
         fVar183 * fVar324 + auVar291._4_4_ * (auVar229._4_4_ * auVar291._4_4_ + fVar183 * fVar208);
    auVar244._8_4_ =
         fVar209 * fVar331 + auVar291._8_4_ * (auVar229._8_4_ * auVar291._8_4_ + fVar209 * fVar73);
    auVar244._12_4_ =
         fVar98 * fVar332 + auVar291._12_4_ * (fVar334 * auVar291._12_4_ + fVar98 * fVar101);
    auVar244._16_4_ =
         fVar130 * fVar333 +
         auVar291._16_4_ * (auVar229._0_4_ * auVar291._16_4_ + fVar130 * fVar182);
    auVar244._20_4_ =
         fVar131 * fVar304 +
         auVar291._20_4_ * (auVar229._4_4_ * auVar291._20_4_ + fVar131 * fVar208);
    auVar244._24_4_ =
         fVar132 * fVar312 + auVar291._24_4_ * (auVar229._8_4_ * auVar291._24_4_ + fVar132 * fVar73)
    ;
    auVar244._28_4_ = fVar335 + fVar99 + fVar334 + fVar101;
    auVar256._0_4_ = fVar155 * auVar97._0_4_ + auVar291._0_4_ * auVar206._0_4_;
    auVar256._4_4_ = fVar183 * auVar97._4_4_ + auVar291._4_4_ * auVar206._4_4_;
    auVar256._8_4_ = fVar209 * auVar97._8_4_ + auVar291._8_4_ * auVar206._8_4_;
    auVar256._12_4_ = fVar98 * auVar97._12_4_ + auVar291._12_4_ * auVar206._12_4_;
    auVar256._16_4_ = fVar130 * auVar97._16_4_ + auVar291._16_4_ * auVar206._16_4_;
    auVar256._20_4_ = fVar131 * auVar97._20_4_ + auVar291._20_4_ * auVar206._20_4_;
    auVar256._24_4_ = fVar132 * auVar97._24_4_ + auVar291._24_4_ * auVar206._24_4_;
    auVar256._28_4_ = fVar352 + fVar334 + fVar101;
    auVar278._0_4_ = fVar155 * auVar330._0_4_ + auVar291._0_4_ * auVar244._0_4_;
    auVar278._4_4_ = fVar183 * auVar330._4_4_ + auVar291._4_4_ * auVar244._4_4_;
    auVar278._8_4_ = fVar209 * auVar330._8_4_ + auVar291._8_4_ * auVar244._8_4_;
    auVar278._12_4_ = fVar98 * auVar330._12_4_ + auVar291._12_4_ * auVar244._12_4_;
    auVar278._16_4_ = fVar130 * auVar330._16_4_ + auVar291._16_4_ * auVar244._16_4_;
    auVar278._20_4_ = fVar131 * auVar330._20_4_ + auVar291._20_4_ * auVar244._20_4_;
    auVar278._24_4_ = fVar132 * auVar330._24_4_ + auVar291._24_4_ * auVar244._24_4_;
    auVar278._28_4_ = auVar23._28_4_ + auVar291._28_4_;
    auVar25 = vsubps_avx(auVar206,auVar97);
    auVar23 = vsubps_avx(auVar244,auVar330);
    local_f8 = (float)local_588._0_4_ * auVar25._0_4_ * 3.0;
    fStack_f4 = (float)local_588._4_4_ * auVar25._4_4_ * 3.0;
    auVar21._4_4_ = fStack_f4;
    auVar21._0_4_ = local_f8;
    fStack_f0 = fStack_580 * auVar25._8_4_ * 3.0;
    auVar21._8_4_ = fStack_f0;
    fStack_ec = fStack_57c * auVar25._12_4_ * 3.0;
    auVar21._12_4_ = fStack_ec;
    fStack_e8 = (float)local_588._0_4_ * auVar25._16_4_ * 3.0;
    auVar21._16_4_ = fStack_e8;
    fStack_e4 = (float)local_588._4_4_ * auVar25._20_4_ * 3.0;
    auVar21._20_4_ = fStack_e4;
    fStack_e0 = fStack_580 * auVar25._24_4_ * 3.0;
    auVar21._24_4_ = fStack_e0;
    auVar21._28_4_ = auVar244._28_4_;
    local_118 = (float)local_588._0_4_ * auVar23._0_4_ * 3.0;
    fStack_114 = (float)local_588._4_4_ * auVar23._4_4_ * 3.0;
    auVar22._4_4_ = fStack_114;
    auVar22._0_4_ = local_118;
    fStack_110 = fStack_580 * auVar23._8_4_ * 3.0;
    auVar22._8_4_ = fStack_110;
    fStack_10c = fStack_57c * auVar23._12_4_ * 3.0;
    auVar22._12_4_ = fStack_10c;
    local_588._0_4_ = (float)local_588._0_4_ * auVar23._16_4_ * 3.0;
    auVar22._16_4_ = local_588._0_4_;
    local_588._4_4_ = (float)local_588._4_4_ * auVar23._20_4_ * 3.0;
    auVar22._20_4_ = local_588._4_4_;
    fStack_580 = fStack_580 * auVar23._24_4_ * 3.0;
    auVar22._24_4_ = fStack_580;
    auVar22._28_4_ = fStack_57c;
    auVar25 = vperm2f128_avx(auVar256,auVar256,1);
    auVar25 = vshufps_avx(auVar25,auVar256,0x30);
    auVar97 = vshufps_avx(auVar256,auVar25,0x29);
    auVar23 = vsubps_avx(auVar256,auVar21);
    auVar25 = vperm2f128_avx(auVar23,auVar23,1);
    auVar25 = vshufps_avx(auVar25,auVar23,0x30);
    auVar21 = vshufps_avx(auVar23,auVar25,0x29);
    auVar23 = vsubps_avx(auVar278,auVar22);
    auVar25 = vperm2f128_avx(auVar23,auVar23,1);
    auVar25 = vshufps_avx(auVar25,auVar23,0x30);
    auVar22 = vshufps_avx(auVar23,auVar25,0x29);
    auVar26 = vsubps_avx(auVar256,local_78);
    auVar27 = vsubps_avx(auVar97,auVar96);
    fVar155 = auVar27._0_4_ + auVar26._0_4_;
    fVar156 = auVar27._4_4_ + auVar26._4_4_;
    fVar157 = auVar27._8_4_ + auVar26._8_4_;
    fVar182 = auVar27._12_4_ + auVar26._12_4_;
    fVar183 = auVar27._16_4_ + auVar26._16_4_;
    fVar184 = auVar27._20_4_ + auVar26._20_4_;
    fVar185 = auVar27._24_4_ + auVar26._24_4_;
    auVar23 = vperm2f128_avx(local_98,local_98,1);
    auVar23 = vshufps_avx(auVar23,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar23,0x29);
    auVar23 = vperm2f128_avx(auVar278,auVar278,1);
    auVar23 = vshufps_avx(auVar23,auVar278,0x30);
    auVar178 = vshufps_avx(auVar278,auVar23,0x29);
    auVar23 = vsubps_avx(auVar278,local_98);
    auVar206 = vsubps_avx(auVar178,local_b8);
    fVar208 = auVar23._0_4_ + auVar206._0_4_;
    fVar209 = auVar23._4_4_ + auVar206._4_4_;
    fVar210 = auVar23._8_4_ + auVar206._8_4_;
    fVar211 = auVar23._12_4_ + auVar206._12_4_;
    fVar73 = auVar23._16_4_ + auVar206._16_4_;
    fVar98 = auVar23._20_4_ + auVar206._20_4_;
    fVar99 = auVar23._24_4_ + auVar206._24_4_;
    fVar100 = auVar23._28_4_;
    auVar23._4_4_ = local_98._4_4_ * fVar156;
    auVar23._0_4_ = local_98._0_4_ * fVar155;
    auVar23._8_4_ = local_98._8_4_ * fVar157;
    auVar23._12_4_ = local_98._12_4_ * fVar182;
    auVar23._16_4_ = local_98._16_4_ * fVar183;
    auVar23._20_4_ = local_98._20_4_ * fVar184;
    auVar23._24_4_ = local_98._24_4_ * fVar185;
    auVar23._28_4_ = fVar100;
    auVar28._4_4_ = fVar209 * local_78._4_4_;
    auVar28._0_4_ = fVar208 * local_78._0_4_;
    auVar28._8_4_ = fVar210 * local_78._8_4_;
    auVar28._12_4_ = fVar211 * local_78._12_4_;
    auVar28._16_4_ = fVar73 * local_78._16_4_;
    auVar28._20_4_ = fVar98 * local_78._20_4_;
    auVar28._24_4_ = fVar99 * local_78._24_4_;
    auVar28._28_4_ = auVar25._28_4_;
    auVar23 = vsubps_avx(auVar23,auVar28);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar24._28_4_;
    fVar279 = local_98._0_4_ + fVar279;
    fVar292 = local_98._4_4_ + fVar292;
    fVar293 = local_98._8_4_ + fVar293;
    fVar294 = local_98._12_4_ + fVar294;
    fVar303 = local_98._16_4_ + fVar303;
    fVar311 = local_98._20_4_ + fVar311;
    fVar313 = local_98._24_4_ + fVar313;
    auVar24._4_4_ = fVar292 * fVar156;
    auVar24._0_4_ = fVar279 * fVar155;
    auVar24._8_4_ = fVar293 * fVar157;
    auVar24._12_4_ = fVar294 * fVar182;
    auVar24._16_4_ = fVar303 * fVar183;
    auVar24._20_4_ = fVar311 * fVar184;
    auVar24._24_4_ = fVar313 * fVar185;
    auVar24._28_4_ = fVar100;
    auVar29._4_4_ = fVar209 * fStack_d4;
    auVar29._0_4_ = fVar208 * local_d8;
    auVar29._8_4_ = fVar210 * fStack_d0;
    auVar29._12_4_ = fVar211 * fStack_cc;
    auVar29._16_4_ = fVar73 * fStack_c8;
    auVar29._20_4_ = fVar98 * fStack_c4;
    auVar29._24_4_ = fVar99 * fStack_c0;
    auVar29._28_4_ = fStack_bc;
    auVar24 = vsubps_avx(auVar24,auVar29);
    auVar30._4_4_ = auVar95._4_4_ * fVar156;
    auVar30._0_4_ = auVar95._0_4_ * fVar155;
    auVar30._8_4_ = auVar95._8_4_ * fVar157;
    auVar30._12_4_ = auVar95._12_4_ * fVar182;
    auVar30._16_4_ = auVar95._16_4_ * fVar183;
    auVar30._20_4_ = auVar95._20_4_ * fVar184;
    auVar30._24_4_ = auVar95._24_4_ * fVar185;
    auVar30._28_4_ = fVar100;
    local_518 = auVar94._0_4_;
    fStack_514 = auVar94._4_4_;
    fStack_510 = auVar94._8_4_;
    fStack_50c = auVar94._12_4_;
    fStack_508 = auVar94._16_4_;
    fStack_504 = auVar94._20_4_;
    fStack_500 = auVar94._24_4_;
    auVar31._4_4_ = fVar209 * fStack_514;
    auVar31._0_4_ = fVar208 * local_518;
    auVar31._8_4_ = fVar210 * fStack_510;
    auVar31._12_4_ = fVar211 * fStack_50c;
    auVar31._16_4_ = fVar73 * fStack_508;
    auVar31._20_4_ = fVar98 * fStack_504;
    auVar31._24_4_ = fVar99 * fStack_500;
    auVar31._28_4_ = 0x40400000;
    auVar28 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = local_b8._4_4_ * fVar156;
    auVar32._0_4_ = local_b8._0_4_ * fVar155;
    auVar32._8_4_ = local_b8._8_4_ * fVar157;
    auVar32._12_4_ = local_b8._12_4_ * fVar182;
    auVar32._16_4_ = local_b8._16_4_ * fVar183;
    auVar32._20_4_ = local_b8._20_4_ * fVar184;
    auVar32._24_4_ = local_b8._24_4_ * fVar185;
    auVar32._28_4_ = fVar100;
    auVar33._4_4_ = auVar96._4_4_ * fVar209;
    auVar33._0_4_ = auVar96._0_4_ * fVar208;
    auVar33._8_4_ = auVar96._8_4_ * fVar210;
    auVar33._12_4_ = auVar96._12_4_ * fVar211;
    auVar33._16_4_ = auVar96._16_4_ * fVar73;
    auVar33._20_4_ = auVar96._20_4_ * fVar98;
    auVar33._24_4_ = auVar96._24_4_ * fVar99;
    auVar33._28_4_ = local_b8._28_4_;
    auVar29 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = auVar278._4_4_ * fVar156;
    auVar34._0_4_ = auVar278._0_4_ * fVar155;
    auVar34._8_4_ = auVar278._8_4_ * fVar157;
    auVar34._12_4_ = auVar278._12_4_ * fVar182;
    auVar34._16_4_ = auVar278._16_4_ * fVar183;
    auVar34._20_4_ = auVar278._20_4_ * fVar184;
    auVar34._24_4_ = auVar278._24_4_ * fVar185;
    auVar34._28_4_ = fVar100;
    auVar35._4_4_ = fVar209 * auVar256._4_4_;
    auVar35._0_4_ = fVar208 * auVar256._0_4_;
    auVar35._8_4_ = fVar210 * auVar256._8_4_;
    auVar35._12_4_ = fVar211 * auVar256._12_4_;
    auVar35._16_4_ = fVar73 * auVar256._16_4_;
    auVar35._20_4_ = fVar98 * auVar256._20_4_;
    auVar35._24_4_ = fVar99 * auVar256._24_4_;
    auVar35._28_4_ = auVar95._28_4_;
    auVar30 = vsubps_avx(auVar34,auVar35);
    local_f8 = auVar256._0_4_ + local_f8;
    fStack_f4 = auVar256._4_4_ + fStack_f4;
    fStack_f0 = auVar256._8_4_ + fStack_f0;
    fStack_ec = auVar256._12_4_ + fStack_ec;
    fStack_e8 = auVar256._16_4_ + fStack_e8;
    fStack_e4 = auVar256._20_4_ + fStack_e4;
    fStack_e0 = auVar256._24_4_ + fStack_e0;
    fStack_dc = auVar256._28_4_ + auVar244._28_4_;
    local_118 = auVar278._0_4_ + local_118;
    fStack_114 = auVar278._4_4_ + fStack_114;
    fStack_110 = auVar278._8_4_ + fStack_110;
    fStack_10c = auVar278._12_4_ + fStack_10c;
    fStack_108 = auVar278._16_4_ + (float)local_588._0_4_;
    fStack_104 = auVar278._20_4_ + (float)local_588._4_4_;
    fStack_100 = auVar278._24_4_ + fStack_580;
    fStack_fc = auVar278._28_4_ + fStack_57c;
    auVar36._4_4_ = fStack_114 * fVar156;
    auVar36._0_4_ = local_118 * fVar155;
    auVar36._8_4_ = fStack_110 * fVar157;
    auVar36._12_4_ = fStack_10c * fVar182;
    auVar36._16_4_ = fStack_108 * fVar183;
    auVar36._20_4_ = fStack_104 * fVar184;
    auVar36._24_4_ = fStack_100 * fVar185;
    auVar36._28_4_ = auVar278._28_4_ + fStack_57c;
    auVar37._4_4_ = fStack_f4 * fVar209;
    auVar37._0_4_ = local_f8 * fVar208;
    auVar37._8_4_ = fStack_f0 * fVar210;
    auVar37._12_4_ = fStack_ec * fVar211;
    auVar37._16_4_ = fStack_e8 * fVar73;
    auVar37._20_4_ = fStack_e4 * fVar98;
    auVar37._24_4_ = fStack_e0 * fVar99;
    auVar37._28_4_ = fStack_dc;
    auVar31 = vsubps_avx(auVar36,auVar37);
    auVar38._4_4_ = auVar22._4_4_ * fVar156;
    auVar38._0_4_ = auVar22._0_4_ * fVar155;
    auVar38._8_4_ = auVar22._8_4_ * fVar157;
    auVar38._12_4_ = auVar22._12_4_ * fVar182;
    auVar38._16_4_ = auVar22._16_4_ * fVar183;
    auVar38._20_4_ = auVar22._20_4_ * fVar184;
    auVar38._24_4_ = auVar22._24_4_ * fVar185;
    auVar38._28_4_ = fStack_dc;
    auVar39._4_4_ = fVar209 * auVar21._4_4_;
    auVar39._0_4_ = fVar208 * auVar21._0_4_;
    auVar39._8_4_ = fVar210 * auVar21._8_4_;
    auVar39._12_4_ = fVar211 * auVar21._12_4_;
    auVar39._16_4_ = fVar73 * auVar21._16_4_;
    auVar39._20_4_ = fVar98 * auVar21._20_4_;
    auVar39._24_4_ = fVar99 * auVar21._24_4_;
    auVar39._28_4_ = auVar21._28_4_;
    auVar32 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = auVar178._4_4_ * fVar156;
    auVar40._0_4_ = auVar178._0_4_ * fVar155;
    auVar40._8_4_ = auVar178._8_4_ * fVar157;
    auVar40._12_4_ = auVar178._12_4_ * fVar182;
    auVar40._16_4_ = auVar178._16_4_ * fVar183;
    auVar40._20_4_ = auVar178._20_4_ * fVar184;
    auVar40._24_4_ = auVar178._24_4_ * fVar185;
    auVar40._28_4_ = auVar27._28_4_ + auVar26._28_4_;
    auVar27._4_4_ = auVar97._4_4_ * fVar209;
    auVar27._0_4_ = auVar97._0_4_ * fVar208;
    auVar27._8_4_ = auVar97._8_4_ * fVar210;
    auVar27._12_4_ = auVar97._12_4_ * fVar211;
    auVar27._16_4_ = auVar97._16_4_ * fVar73;
    auVar27._20_4_ = auVar97._20_4_ * fVar98;
    auVar27._24_4_ = auVar97._24_4_ * fVar99;
    auVar27._28_4_ = fVar100 + auVar206._28_4_;
    auVar27 = vsubps_avx(auVar40,auVar27);
    auVar25 = vminps_avx(auVar23,auVar24);
    auVar94 = vmaxps_avx(auVar23,auVar24);
    auVar23 = vminps_avx(auVar28,auVar29);
    auVar23 = vminps_avx(auVar25,auVar23);
    auVar25 = vmaxps_avx(auVar28,auVar29);
    auVar94 = vmaxps_avx(auVar94,auVar25);
    auVar24 = vminps_avx(auVar30,auVar31);
    auVar25 = vmaxps_avx(auVar30,auVar31);
    auVar26 = vminps_avx(auVar32,auVar27);
    auVar24 = vminps_avx(auVar24,auVar26);
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar32,auVar27);
    auVar25 = vmaxps_avx(auVar25,auVar23);
    auVar25 = vmaxps_avx(auVar94,auVar25);
    auVar94 = vcmpps_avx(auVar24,local_138,2);
    auVar25 = vcmpps_avx(auVar25,local_158,5);
    auVar94 = vandps_avx(auVar25,auVar94);
    auVar25 = local_228 & auVar94;
    uVar66 = 0;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0x7f,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0xbf,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0')
    {
      auVar25 = vsubps_avx(auVar96,local_78);
      auVar23 = vsubps_avx(auVar97,auVar256);
      fVar156 = auVar25._0_4_ + auVar23._0_4_;
      fVar157 = auVar25._4_4_ + auVar23._4_4_;
      fVar182 = auVar25._8_4_ + auVar23._8_4_;
      fVar183 = auVar25._12_4_ + auVar23._12_4_;
      fVar184 = auVar25._16_4_ + auVar23._16_4_;
      fVar185 = auVar25._20_4_ + auVar23._20_4_;
      fVar208 = auVar25._24_4_ + auVar23._24_4_;
      auVar24 = vsubps_avx(local_b8,local_98);
      auVar26 = vsubps_avx(auVar178,auVar278);
      fVar209 = auVar24._0_4_ + auVar26._0_4_;
      fVar210 = auVar24._4_4_ + auVar26._4_4_;
      fVar211 = auVar24._8_4_ + auVar26._8_4_;
      fVar73 = auVar24._12_4_ + auVar26._12_4_;
      fVar98 = auVar24._16_4_ + auVar26._16_4_;
      fVar99 = auVar24._20_4_ + auVar26._20_4_;
      fVar100 = auVar24._24_4_ + auVar26._24_4_;
      fVar155 = auVar26._28_4_;
      auVar41._4_4_ = local_98._4_4_ * fVar157;
      auVar41._0_4_ = local_98._0_4_ * fVar156;
      auVar41._8_4_ = local_98._8_4_ * fVar182;
      auVar41._12_4_ = local_98._12_4_ * fVar183;
      auVar41._16_4_ = local_98._16_4_ * fVar184;
      auVar41._20_4_ = local_98._20_4_ * fVar185;
      auVar41._24_4_ = local_98._24_4_ * fVar208;
      auVar41._28_4_ = local_98._28_4_;
      auVar42._4_4_ = local_78._4_4_ * fVar210;
      auVar42._0_4_ = local_78._0_4_ * fVar209;
      auVar42._8_4_ = local_78._8_4_ * fVar211;
      auVar42._12_4_ = local_78._12_4_ * fVar73;
      auVar42._16_4_ = local_78._16_4_ * fVar98;
      auVar42._20_4_ = local_78._20_4_ * fVar99;
      auVar42._24_4_ = local_78._24_4_ * fVar100;
      auVar42._28_4_ = local_78._28_4_;
      auVar26 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = fVar292 * fVar157;
      auVar43._0_4_ = fVar279 * fVar156;
      auVar43._8_4_ = fVar293 * fVar182;
      auVar43._12_4_ = fVar294 * fVar183;
      auVar43._16_4_ = fVar303 * fVar184;
      auVar43._20_4_ = fVar311 * fVar185;
      auVar43._24_4_ = fVar313 * fVar208;
      auVar43._28_4_ = local_98._28_4_;
      auVar44._4_4_ = fVar210 * fStack_d4;
      auVar44._0_4_ = fVar209 * local_d8;
      auVar44._8_4_ = fVar211 * fStack_d0;
      auVar44._12_4_ = fVar73 * fStack_cc;
      auVar44._16_4_ = fVar98 * fStack_c8;
      auVar44._20_4_ = fVar99 * fStack_c4;
      auVar44._24_4_ = fVar100 * fStack_c0;
      auVar44._28_4_ = fVar155;
      auVar27 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar157 * auVar95._4_4_;
      auVar45._0_4_ = fVar156 * auVar95._0_4_;
      auVar45._8_4_ = fVar182 * auVar95._8_4_;
      auVar45._12_4_ = fVar183 * auVar95._12_4_;
      auVar45._16_4_ = fVar184 * auVar95._16_4_;
      auVar45._20_4_ = fVar185 * auVar95._20_4_;
      auVar45._24_4_ = fVar208 * auVar95._24_4_;
      auVar45._28_4_ = fVar155;
      auVar46._4_4_ = fVar210 * fStack_514;
      auVar46._0_4_ = fVar209 * local_518;
      auVar46._8_4_ = fVar211 * fStack_510;
      auVar46._12_4_ = fVar73 * fStack_50c;
      auVar46._16_4_ = fVar98 * fStack_508;
      auVar46._20_4_ = fVar99 * fStack_504;
      auVar46._24_4_ = fVar100 * fStack_500;
      auVar46._28_4_ = local_98._28_4_ + auVar205._28_4_;
      auVar95 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = local_b8._4_4_ * fVar157;
      auVar47._0_4_ = local_b8._0_4_ * fVar156;
      auVar47._8_4_ = local_b8._8_4_ * fVar182;
      auVar47._12_4_ = local_b8._12_4_ * fVar183;
      auVar47._16_4_ = local_b8._16_4_ * fVar184;
      auVar47._20_4_ = local_b8._20_4_ * fVar185;
      auVar47._24_4_ = local_b8._24_4_ * fVar208;
      auVar47._28_4_ = local_98._28_4_ + auVar205._28_4_;
      auVar48._4_4_ = auVar96._4_4_ * fVar210;
      auVar48._0_4_ = auVar96._0_4_ * fVar209;
      auVar48._8_4_ = auVar96._8_4_ * fVar211;
      auVar48._12_4_ = auVar96._12_4_ * fVar73;
      auVar48._16_4_ = auVar96._16_4_ * fVar98;
      auVar48._20_4_ = auVar96._20_4_ * fVar99;
      uVar9 = auVar96._28_4_;
      auVar48._24_4_ = auVar96._24_4_ * fVar100;
      auVar48._28_4_ = uVar9;
      auVar96 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = auVar278._4_4_ * fVar157;
      auVar49._0_4_ = auVar278._0_4_ * fVar156;
      auVar49._8_4_ = auVar278._8_4_ * fVar182;
      auVar49._12_4_ = auVar278._12_4_ * fVar183;
      auVar49._16_4_ = auVar278._16_4_ * fVar184;
      auVar49._20_4_ = auVar278._20_4_ * fVar185;
      auVar49._24_4_ = auVar278._24_4_ * fVar208;
      auVar49._28_4_ = auVar278._28_4_;
      auVar50._4_4_ = auVar256._4_4_ * fVar210;
      auVar50._0_4_ = auVar256._0_4_ * fVar209;
      auVar50._8_4_ = auVar256._8_4_ * fVar211;
      auVar50._12_4_ = auVar256._12_4_ * fVar73;
      auVar50._16_4_ = auVar256._16_4_ * fVar98;
      auVar50._20_4_ = auVar256._20_4_ * fVar99;
      auVar50._24_4_ = auVar256._24_4_ * fVar100;
      auVar50._28_4_ = auVar256._28_4_;
      auVar206 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar157 * fStack_114;
      auVar51._0_4_ = fVar156 * local_118;
      auVar51._8_4_ = fVar182 * fStack_110;
      auVar51._12_4_ = fVar183 * fStack_10c;
      auVar51._16_4_ = fVar184 * fStack_108;
      auVar51._20_4_ = fVar185 * fStack_104;
      auVar51._24_4_ = fVar208 * fStack_100;
      auVar51._28_4_ = auVar278._28_4_;
      auVar52._4_4_ = fVar210 * fStack_f4;
      auVar52._0_4_ = fVar209 * local_f8;
      auVar52._8_4_ = fVar211 * fStack_f0;
      auVar52._12_4_ = fVar73 * fStack_ec;
      auVar52._16_4_ = fVar98 * fStack_e8;
      auVar52._20_4_ = fVar99 * fStack_e4;
      auVar52._24_4_ = fVar100 * fStack_e0;
      auVar52._28_4_ = uVar9;
      auVar28 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar157 * auVar22._4_4_;
      auVar53._0_4_ = fVar156 * auVar22._0_4_;
      auVar53._8_4_ = fVar182 * auVar22._8_4_;
      auVar53._12_4_ = fVar183 * auVar22._12_4_;
      auVar53._16_4_ = fVar184 * auVar22._16_4_;
      auVar53._20_4_ = fVar185 * auVar22._20_4_;
      auVar53._24_4_ = fVar208 * auVar22._24_4_;
      auVar53._28_4_ = uVar9;
      auVar54._4_4_ = fVar210 * auVar21._4_4_;
      auVar54._0_4_ = fVar209 * auVar21._0_4_;
      auVar54._8_4_ = fVar211 * auVar21._8_4_;
      auVar54._12_4_ = fVar73 * auVar21._12_4_;
      auVar54._16_4_ = fVar98 * auVar21._16_4_;
      auVar54._20_4_ = fVar99 * auVar21._20_4_;
      auVar54._24_4_ = fVar100 * auVar21._24_4_;
      auVar54._28_4_ = local_b8._28_4_;
      auVar21 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = auVar178._4_4_ * fVar157;
      auVar55._0_4_ = auVar178._0_4_ * fVar156;
      auVar55._8_4_ = auVar178._8_4_ * fVar182;
      auVar55._12_4_ = auVar178._12_4_ * fVar183;
      auVar55._16_4_ = auVar178._16_4_ * fVar184;
      auVar55._20_4_ = auVar178._20_4_ * fVar185;
      auVar55._24_4_ = auVar178._24_4_ * fVar208;
      auVar55._28_4_ = auVar25._28_4_ + auVar23._28_4_;
      auVar56._4_4_ = auVar97._4_4_ * fVar210;
      auVar56._0_4_ = auVar97._0_4_ * fVar209;
      auVar56._8_4_ = auVar97._8_4_ * fVar211;
      auVar56._12_4_ = auVar97._12_4_ * fVar73;
      auVar56._16_4_ = auVar97._16_4_ * fVar98;
      auVar56._20_4_ = auVar97._20_4_ * fVar99;
      auVar56._24_4_ = auVar97._24_4_ * fVar100;
      auVar56._28_4_ = auVar24._28_4_ + fVar155;
      auVar97 = vsubps_avx(auVar55,auVar56);
      auVar23 = vminps_avx(auVar26,auVar27);
      auVar25 = vmaxps_avx(auVar26,auVar27);
      auVar24 = vminps_avx(auVar95,auVar96);
      auVar24 = vminps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(auVar95,auVar96);
      auVar25 = vmaxps_avx(auVar25,auVar23);
      auVar26 = vminps_avx(auVar206,auVar28);
      auVar23 = vmaxps_avx(auVar206,auVar28);
      auVar95 = vminps_avx(auVar21,auVar97);
      auVar26 = vminps_avx(auVar26,auVar95);
      auVar26 = vminps_avx(auVar24,auVar26);
      auVar24 = vmaxps_avx(auVar21,auVar97);
      auVar23 = vmaxps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(auVar25,auVar23);
      auVar25 = vcmpps_avx(auVar26,local_138,2);
      auVar23 = vcmpps_avx(auVar23,local_158,5);
      auVar25 = vandps_avx(auVar23,auVar25);
      auVar94 = vandps_avx(auVar94,local_228);
      auVar23 = auVar94 & auVar25;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0x7f,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0xbf,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar23[0x1f] < '\0') {
        auVar94 = vandps_avx(auVar25,auVar94);
        uVar66 = vmovmskps_avx(auVar94);
      }
    }
    if (uVar66 != 0) {
      uVar70 = (ulong)uVar72;
      auStack_368[uVar70] = uVar66;
      uVar10 = vmovlps_avx(local_2e8);
      *(undefined8 *)(afStack_208 + uVar70 * 2) = uVar10;
      uVar68 = vmovlps_avx(_local_5e8);
      auStack_58[uVar70] = uVar68;
      uVar72 = uVar72 + 1;
    }
    auVar351 = ZEXT464(0) << 0x20;
    do {
      if (uVar72 == 0) {
        uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar93._4_4_ = uVar9;
        auVar93._0_4_ = uVar9;
        auVar93._8_4_ = uVar9;
        auVar93._12_4_ = uVar9;
        auVar118 = vcmpps_avx(local_338,auVar93,2);
        uVar67 = vmovmskps_avx(auVar118);
        uVar65 = uVar65 & (uint)local_430 & uVar67;
        if (uVar65 == 0) {
          return;
        }
        goto LAB_00ffbef7;
      }
      uVar70 = (ulong)(uVar72 - 1);
      uVar66 = auStack_368[uVar70];
      fVar155 = afStack_208[uVar70 * 2];
      fVar156 = afStack_208[uVar70 * 2 + 1];
      register0x00001588 = 0;
      local_5e8 = (undefined1  [8])auStack_58[uVar70];
      uVar68 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> uVar68 & 1) == 0; uVar68 = uVar68 + 1) {
        }
      }
      uVar66 = uVar66 - 1 & uVar66;
      auStack_368[uVar70] = uVar66;
      if (uVar66 == 0) {
        uVar72 = uVar72 - 1;
      }
      auVar221._8_4_ = 0x3f800000;
      auVar221._0_8_ = &DAT_3f8000003f800000;
      auVar221._12_4_ = 0x3f800000;
      fVar182 = (float)(uVar68 + 1) * 0.14285715;
      fVar157 = (1.0 - (float)uVar68 * 0.14285715) * fVar155 + fVar156 * (float)uVar68 * 0.14285715;
      fVar155 = (1.0 - fVar182) * fVar155 + fVar156 * fVar182;
      fVar156 = fVar155 - fVar157;
      if (0.16666667 <= fVar156) break;
      auVar118 = vshufps_avx(_local_5e8,_local_5e8,0x50);
      auVar165 = vsubps_avx(auVar221,auVar118);
      fVar182 = auVar118._0_4_;
      fVar183 = auVar118._4_4_;
      fVar184 = auVar118._8_4_;
      fVar185 = auVar118._12_4_;
      fVar208 = auVar165._0_4_;
      fVar209 = auVar165._4_4_;
      fVar210 = auVar165._8_4_;
      fVar211 = auVar165._12_4_;
      auVar168._0_4_ = auVar270._0_4_ * fVar182 + fVar208 * (float)local_4f8._0_4_;
      auVar168._4_4_ = auVar270._4_4_ * fVar183 + fVar209 * (float)local_4f8._4_4_;
      auVar168._8_4_ = auVar270._0_4_ * fVar184 + fVar210 * (float)local_4f8._0_4_;
      auVar168._12_4_ = auVar270._4_4_ * fVar185 + fVar211 * (float)local_4f8._4_4_;
      auVar197._0_4_ = auVar281._0_4_ * fVar182 + fVar208 * (float)local_378._0_4_;
      auVar197._4_4_ = auVar281._4_4_ * fVar183 + fVar209 * (float)local_378._4_4_;
      auVar197._8_4_ = auVar281._0_4_ * fVar184 + fVar210 * fStack_370;
      auVar197._12_4_ = auVar281._4_4_ * fVar185 + fVar211 * fStack_36c;
      auVar222._0_4_ = auVar297._0_4_ * fVar182 + fVar208 * auVar196._0_4_;
      auVar222._4_4_ = auVar297._4_4_ * fVar183 + fVar209 * auVar196._4_4_;
      auVar222._8_4_ = auVar297._0_4_ * fVar184 + fVar210 * auVar196._0_4_;
      auVar222._12_4_ = auVar297._4_4_ * fVar185 + fVar211 * auVar196._4_4_;
      auVar114._0_4_ = auVar89._0_4_ * fVar182 + auVar112._0_4_ * fVar208;
      auVar114._4_4_ = auVar89._4_4_ * fVar183 + auVar112._4_4_ * fVar209;
      auVar114._8_4_ = auVar89._0_4_ * fVar184 + auVar112._0_4_ * fVar210;
      auVar114._12_4_ = auVar89._4_4_ * fVar185 + auVar112._4_4_ * fVar211;
      auVar152._16_16_ = auVar168;
      auVar152._0_16_ = auVar168;
      auVar179._16_16_ = auVar197;
      auVar179._0_16_ = auVar197;
      auVar207._16_16_ = auVar222;
      auVar207._0_16_ = auVar222;
      auVar94 = vshufps_avx(ZEXT2032(CONCAT416(fVar155,ZEXT416((uint)fVar157))),
                            ZEXT2032(CONCAT416(fVar155,ZEXT416((uint)fVar157))),0);
      auVar25 = vsubps_avx(auVar179,auVar152);
      fVar182 = auVar94._0_4_;
      fVar183 = auVar94._4_4_;
      fVar184 = auVar94._8_4_;
      fVar185 = auVar94._12_4_;
      fVar208 = auVar94._16_4_;
      fVar209 = auVar94._20_4_;
      fVar210 = auVar94._24_4_;
      auVar153._0_4_ = auVar168._0_4_ + auVar25._0_4_ * fVar182;
      auVar153._4_4_ = auVar168._4_4_ + auVar25._4_4_ * fVar183;
      auVar153._8_4_ = auVar168._8_4_ + auVar25._8_4_ * fVar184;
      auVar153._12_4_ = auVar168._12_4_ + auVar25._12_4_ * fVar185;
      auVar153._16_4_ = auVar168._0_4_ + auVar25._16_4_ * fVar208;
      auVar153._20_4_ = auVar168._4_4_ + auVar25._20_4_ * fVar209;
      auVar153._24_4_ = auVar168._8_4_ + auVar25._24_4_ * fVar210;
      auVar153._28_4_ = auVar168._12_4_ + auVar25._28_4_;
      auVar25 = vsubps_avx(auVar207,auVar179);
      auVar180._0_4_ = auVar197._0_4_ + auVar25._0_4_ * fVar182;
      auVar180._4_4_ = auVar197._4_4_ + auVar25._4_4_ * fVar183;
      auVar180._8_4_ = auVar197._8_4_ + auVar25._8_4_ * fVar184;
      auVar180._12_4_ = auVar197._12_4_ + auVar25._12_4_ * fVar185;
      auVar180._16_4_ = auVar197._0_4_ + auVar25._16_4_ * fVar208;
      auVar180._20_4_ = auVar197._4_4_ + auVar25._20_4_ * fVar209;
      auVar180._24_4_ = auVar197._8_4_ + auVar25._24_4_ * fVar210;
      auVar180._28_4_ = auVar197._12_4_ + auVar25._28_4_;
      auVar118 = vsubps_avx(auVar114,auVar222);
      auVar128._0_4_ = auVar222._0_4_ + auVar118._0_4_ * fVar182;
      auVar128._4_4_ = auVar222._4_4_ + auVar118._4_4_ * fVar183;
      auVar128._8_4_ = auVar222._8_4_ + auVar118._8_4_ * fVar184;
      auVar128._12_4_ = auVar222._12_4_ + auVar118._12_4_ * fVar185;
      auVar128._16_4_ = auVar222._0_4_ + auVar118._0_4_ * fVar208;
      auVar128._20_4_ = auVar222._4_4_ + auVar118._4_4_ * fVar209;
      auVar128._24_4_ = auVar222._8_4_ + auVar118._8_4_ * fVar210;
      auVar128._28_4_ = auVar222._12_4_ + auVar118._12_4_;
      auVar25 = vsubps_avx(auVar180,auVar153);
      auVar154._0_4_ = auVar153._0_4_ + fVar182 * auVar25._0_4_;
      auVar154._4_4_ = auVar153._4_4_ + fVar183 * auVar25._4_4_;
      auVar154._8_4_ = auVar153._8_4_ + fVar184 * auVar25._8_4_;
      auVar154._12_4_ = auVar153._12_4_ + fVar185 * auVar25._12_4_;
      auVar154._16_4_ = auVar153._16_4_ + fVar208 * auVar25._16_4_;
      auVar154._20_4_ = auVar153._20_4_ + fVar209 * auVar25._20_4_;
      auVar154._24_4_ = auVar153._24_4_ + fVar210 * auVar25._24_4_;
      auVar154._28_4_ = auVar153._28_4_ + auVar25._28_4_;
      auVar25 = vsubps_avx(auVar128,auVar180);
      auVar129._0_4_ = auVar180._0_4_ + fVar182 * auVar25._0_4_;
      auVar129._4_4_ = auVar180._4_4_ + fVar183 * auVar25._4_4_;
      auVar129._8_4_ = auVar180._8_4_ + fVar184 * auVar25._8_4_;
      auVar129._12_4_ = auVar180._12_4_ + fVar185 * auVar25._12_4_;
      auVar129._16_4_ = auVar180._16_4_ + fVar208 * auVar25._16_4_;
      auVar129._20_4_ = auVar180._20_4_ + fVar209 * auVar25._20_4_;
      auVar129._24_4_ = auVar180._24_4_ + fVar210 * auVar25._24_4_;
      auVar129._28_4_ = auVar180._28_4_ + auVar25._28_4_;
      auVar25 = vsubps_avx(auVar129,auVar154);
      auVar169._0_4_ = auVar154._0_4_ + fVar182 * auVar25._0_4_;
      auVar169._4_4_ = auVar154._4_4_ + fVar183 * auVar25._4_4_;
      auVar169._8_4_ = auVar154._8_4_ + fVar184 * auVar25._8_4_;
      auVar169._12_4_ = auVar154._12_4_ + fVar185 * auVar25._12_4_;
      auVar181._16_4_ = auVar154._16_4_ + fVar208 * auVar25._16_4_;
      auVar181._0_16_ = auVar169;
      auVar181._20_4_ = auVar154._20_4_ + fVar209 * auVar25._20_4_;
      auVar181._24_4_ = auVar154._24_4_ + fVar210 * auVar25._24_4_;
      auVar181._28_4_ = auVar154._28_4_ + auVar180._28_4_;
      fVar182 = auVar25._4_4_ * 3.0;
      auVar147 = auVar181._16_16_;
      auVar117 = vshufps_avx(ZEXT416((uint)(fVar156 * 0.33333334)),
                             ZEXT416((uint)(fVar156 * 0.33333334)),0);
      auVar282._0_4_ = auVar169._0_4_ + auVar117._0_4_ * auVar25._0_4_ * 3.0;
      auVar282._4_4_ = auVar169._4_4_ + auVar117._4_4_ * fVar182;
      auVar282._8_4_ = auVar169._8_4_ + auVar117._8_4_ * auVar25._8_4_ * 3.0;
      auVar282._12_4_ = auVar169._12_4_ + auVar117._12_4_ * auVar25._12_4_ * 3.0;
      auVar229 = vshufpd_avx(auVar169,auVar169,3);
      auVar175 = vshufpd_avx(auVar147,auVar147,3);
      auVar118 = vsubps_avx(auVar229,auVar169);
      auVar165 = vsubps_avx(auVar175,auVar147);
      auVar115._0_4_ = auVar118._0_4_ + auVar165._0_4_;
      auVar115._4_4_ = auVar118._4_4_ + auVar165._4_4_;
      auVar115._8_4_ = auVar118._8_4_ + auVar165._8_4_;
      auVar115._12_4_ = auVar118._12_4_ + auVar165._12_4_;
      auVar118 = vmovshdup_avx(auVar169);
      auVar165 = vmovshdup_avx(auVar282);
      auVar174 = vshufps_avx(auVar115,auVar115,0);
      auVar91 = vshufps_avx(auVar115,auVar115,0x55);
      fVar209 = auVar91._0_4_;
      fVar210 = auVar91._4_4_;
      fVar211 = auVar91._8_4_;
      fVar73 = auVar91._12_4_;
      fVar183 = auVar174._0_4_;
      fVar184 = auVar174._4_4_;
      fVar185 = auVar174._8_4_;
      fVar208 = auVar174._12_4_;
      auVar271._0_4_ = fVar183 * auVar169._0_4_ + fVar209 * auVar118._0_4_;
      auVar271._4_4_ = fVar184 * auVar169._4_4_ + fVar210 * auVar118._4_4_;
      auVar271._8_4_ = fVar185 * auVar169._8_4_ + fVar211 * auVar118._8_4_;
      auVar271._12_4_ = fVar208 * auVar169._12_4_ + fVar73 * auVar118._12_4_;
      auVar283._0_4_ = auVar282._0_4_ * fVar183 + fVar209 * auVar165._0_4_;
      auVar283._4_4_ = auVar282._4_4_ * fVar184 + fVar210 * auVar165._4_4_;
      auVar283._8_4_ = auVar282._8_4_ * fVar185 + fVar211 * auVar165._8_4_;
      auVar283._12_4_ = auVar282._12_4_ * fVar208 + fVar73 * auVar165._12_4_;
      auVar165 = vshufps_avx(auVar271,auVar271,0xe8);
      auVar174 = vshufps_avx(auVar283,auVar283,0xe8);
      auVar118 = vcmpps_avx(auVar165,auVar174,1);
      uVar66 = vextractps_avx(auVar118,0);
      auVar91 = auVar283;
      if ((uVar66 & 1) == 0) {
        auVar91 = auVar271;
      }
      auVar116._0_4_ = auVar117._0_4_ * auVar25._16_4_ * 3.0;
      auVar116._4_4_ = auVar117._4_4_ * fVar182;
      auVar116._8_4_ = auVar117._8_4_ * auVar25._24_4_ * 3.0;
      auVar116._12_4_ = auVar117._12_4_ * auVar94._28_4_;
      auVar75 = vsubps_avx(auVar147,auVar116);
      auVar117 = vmovshdup_avx(auVar75);
      auVar147 = vmovshdup_avx(auVar147);
      fVar182 = auVar75._0_4_;
      fVar98 = auVar75._4_4_;
      auVar348._0_4_ = fVar183 * fVar182 + fVar209 * auVar117._0_4_;
      auVar348._4_4_ = fVar184 * fVar98 + fVar210 * auVar117._4_4_;
      auVar348._8_4_ = fVar185 * auVar75._8_4_ + fVar211 * auVar117._8_4_;
      auVar348._12_4_ = fVar208 * auVar75._12_4_ + fVar73 * auVar117._12_4_;
      auVar327._0_4_ = fVar183 * auVar181._16_4_ + fVar209 * auVar147._0_4_;
      auVar327._4_4_ = fVar184 * auVar181._20_4_ + fVar210 * auVar147._4_4_;
      auVar327._8_4_ = fVar185 * auVar181._24_4_ + fVar211 * auVar147._8_4_;
      auVar327._12_4_ = fVar208 * auVar181._28_4_ + fVar73 * auVar147._12_4_;
      auVar147 = vshufps_avx(auVar348,auVar348,0xe8);
      auVar20 = vshufps_avx(auVar327,auVar327,0xe8);
      auVar117 = vcmpps_avx(auVar147,auVar20,1);
      uVar66 = vextractps_avx(auVar117,0);
      auVar76 = auVar327;
      if ((uVar66 & 1) == 0) {
        auVar76 = auVar348;
      }
      auVar91 = vmaxss_avx(auVar76,auVar91);
      auVar165 = vminps_avx(auVar165,auVar174);
      auVar174 = vminps_avx(auVar147,auVar20);
      auVar174 = vminps_avx(auVar165,auVar174);
      auVar118 = vshufps_avx(auVar118,auVar118,0x55);
      auVar118 = vblendps_avx(auVar118,auVar117,2);
      auVar117 = vpslld_avx(auVar118,0x1f);
      auVar118 = vshufpd_avx(auVar283,auVar283,1);
      auVar118 = vinsertps_avx(auVar118,auVar327,0x9c);
      auVar165 = vshufpd_avx(auVar271,auVar271,1);
      auVar165 = vinsertps_avx(auVar165,auVar348,0x9c);
      auVar118 = vblendvps_avx(auVar165,auVar118,auVar117);
      auVar165 = vmovshdup_avx(auVar118);
      auVar118 = vmaxss_avx(auVar165,auVar118);
      fVar185 = auVar174._0_4_;
      auVar165 = vmovshdup_avx(auVar174);
      fVar184 = auVar118._0_4_;
      fVar208 = auVar165._0_4_;
      fVar183 = auVar91._0_4_;
      if ((0.0001 <= fVar185) || (fVar184 <= -0.0001)) {
        if ((-0.0001 < fVar183 && fVar208 < 0.0001) ||
           ((fVar185 < 0.0001 && -0.0001 < fVar183 || (fVar208 < 0.0001 && -0.0001 < fVar184))))
        goto LAB_00ffd509;
LAB_00ffdf8b:
        bVar57 = true;
        auVar351 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_00ffd509:
        auVar351 = ZEXT464(0) << 0x20;
        auVar117 = vcmpps_avx(auVar174,ZEXT416(0) << 0x20,1);
        auVar165 = vcmpss_avx(auVar91,ZEXT416(0),1);
        auVar340._8_4_ = 0x3f800000;
        auVar340._0_8_ = &DAT_3f8000003f800000;
        auVar340._12_4_ = 0x3f800000;
        auVar223._8_4_ = 0xbf800000;
        auVar223._0_8_ = 0xbf800000bf800000;
        auVar223._12_4_ = 0xbf800000;
        auVar165 = vblendvps_avx(auVar340,auVar223,auVar165);
        auVar117 = vblendvps_avx(auVar340,auVar223,auVar117);
        auVar147 = vcmpss_avx(auVar165,auVar117,4);
        auVar147 = vpshufd_avx(ZEXT416(auVar147._0_4_ & 1),0x50);
        auVar147 = vpslld_avx(auVar147,0x1f);
        auVar147 = vpsrad_avx(auVar147,0x1f);
        auVar147 = vpandn_avx(auVar147,_DAT_02020eb0);
        auVar20 = vmovshdup_avx(auVar117);
        fVar209 = auVar20._0_4_;
        if ((auVar117._0_4_ != fVar209) || (NAN(auVar117._0_4_) || NAN(fVar209))) {
          if ((fVar208 != fVar185) || (NAN(fVar208) || NAN(fVar185))) {
            fVar185 = -fVar185 / (fVar208 - fVar185);
            auVar117 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar185) * 0.0 + fVar185)));
          }
          else {
            auVar117 = vcmpss_avx(auVar174,ZEXT416(0),0);
            auVar117 = vpshufd_avx(ZEXT416(auVar117._0_4_ & 1),0x50);
            auVar117 = vpslld_avx(auVar117,0x1f);
            auVar117 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar117);
          }
          auVar20 = vcmpps_avx(auVar147,auVar117,1);
          auVar174 = vblendps_avx(auVar147,auVar117,2);
          auVar117 = vblendps_avx(auVar117,auVar147,2);
          auVar147 = vblendvps_avx(auVar117,auVar174,auVar20);
        }
        auVar118 = vcmpss_avx(auVar118,ZEXT416(0),1);
        auVar148._8_4_ = 0xbf800000;
        auVar148._0_8_ = 0xbf800000bf800000;
        auVar148._12_4_ = 0xbf800000;
        auVar118 = vblendvps_avx(auVar340,auVar148,auVar118);
        fVar185 = auVar118._0_4_;
        if ((auVar165._0_4_ != fVar185) || (NAN(auVar165._0_4_) || NAN(fVar185))) {
          if ((fVar184 != fVar183) || (NAN(fVar184) || NAN(fVar183))) {
            fVar183 = -fVar183 / (fVar184 - fVar183);
            auVar118 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar183) * 0.0 + fVar183)));
          }
          else {
            auVar118 = vcmpss_avx(auVar91,ZEXT416(0),0);
            auVar118 = vpshufd_avx(ZEXT416(auVar118._0_4_ & 1),0x50);
            auVar118 = vpslld_avx(auVar118,0x1f);
            auVar118 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar118);
          }
          auVar117 = vcmpps_avx(auVar147,auVar118,1);
          auVar165 = vblendps_avx(auVar147,auVar118,2);
          auVar118 = vblendps_avx(auVar118,auVar147,2);
          auVar147 = vblendvps_avx(auVar118,auVar165,auVar117);
        }
        if ((fVar209 != fVar185) || (NAN(fVar209) || NAN(fVar185))) {
          auVar118 = vcmpps_avx(auVar147,auVar340,1);
          auVar165 = vinsertps_avx(auVar147,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar224._4_12_ = auVar147._4_12_;
          auVar224._0_4_ = 0x3f800000;
          auVar147 = vblendvps_avx(auVar224,auVar165,auVar118);
        }
        auVar118 = vcmpps_avx(auVar147,_DAT_01fec6f0,1);
        auVar58._12_4_ = 0;
        auVar58._0_12_ = auVar147._4_12_;
        auVar165 = vinsertps_avx(auVar147,ZEXT416(0x3f800000),0x10);
        auVar118 = vblendvps_avx(auVar165,auVar58 << 0x20,auVar118);
        auVar165 = vmovshdup_avx(auVar118);
        bVar57 = true;
        if (auVar118._0_4_ <= auVar165._0_4_) {
          auVar119._0_4_ = auVar118._0_4_ + -0.1;
          auVar119._4_4_ = auVar118._4_4_ + 0.1;
          auVar119._8_4_ = auVar118._8_4_ + 0.0;
          auVar119._12_4_ = auVar118._12_4_ + 0.0;
          auVar117 = vshufpd_avx(auVar282,auVar282,3);
          auVar170._8_8_ = 0x3f80000000000000;
          auVar170._0_8_ = 0x3f80000000000000;
          auVar118 = vcmpps_avx(auVar119,auVar170,1);
          auVar59._12_4_ = 0;
          auVar59._0_12_ = auVar119._4_12_;
          auVar165 = vinsertps_avx(auVar119,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar118 = vblendvps_avx(auVar165,auVar59 << 0x20,auVar118);
          auVar165 = vshufpd_avx(auVar75,auVar75,3);
          auVar174 = vshufps_avx(auVar118,auVar118,0x50);
          auVar91 = vsubps_avx(auVar340,auVar174);
          local_478 = auVar229._0_4_;
          fStack_474 = auVar229._4_4_;
          fStack_470 = auVar229._8_4_;
          fStack_46c = auVar229._12_4_;
          fVar183 = auVar174._0_4_;
          fVar184 = auVar174._4_4_;
          fVar185 = auVar174._8_4_;
          fVar208 = auVar174._12_4_;
          local_5b8 = auVar175._0_4_;
          fStack_5b4 = auVar175._4_4_;
          fStack_5b0 = auVar175._8_4_;
          fStack_5ac = auVar175._12_4_;
          fVar209 = auVar91._0_4_;
          fVar210 = auVar91._4_4_;
          fVar211 = auVar91._8_4_;
          fVar73 = auVar91._12_4_;
          auVar149._0_4_ = fVar183 * local_478 + fVar209 * auVar169._0_4_;
          auVar149._4_4_ = fVar184 * fStack_474 + fVar210 * auVar169._4_4_;
          auVar149._8_4_ = fVar185 * fStack_470 + fVar211 * auVar169._0_4_;
          auVar149._12_4_ = fVar208 * fStack_46c + fVar73 * auVar169._4_4_;
          auVar198._0_4_ = fVar183 * auVar117._0_4_ + fVar209 * auVar282._0_4_;
          auVar198._4_4_ = fVar184 * auVar117._4_4_ + fVar210 * auVar282._4_4_;
          auVar198._8_4_ = fVar185 * auVar117._8_4_ + fVar211 * auVar282._0_4_;
          auVar198._12_4_ = fVar208 * auVar117._12_4_ + fVar73 * auVar282._4_4_;
          auVar253._0_4_ = fVar183 * auVar165._0_4_ + fVar209 * fVar182;
          auVar253._4_4_ = fVar184 * auVar165._4_4_ + fVar210 * fVar98;
          auVar253._8_4_ = fVar185 * auVar165._8_4_ + fVar211 * fVar182;
          auVar253._12_4_ = fVar208 * auVar165._12_4_ + fVar73 * fVar98;
          auVar272._0_4_ = fVar183 * local_5b8 + fVar209 * auVar181._16_4_;
          auVar272._4_4_ = fVar184 * fStack_5b4 + fVar210 * auVar181._20_4_;
          auVar272._8_4_ = fVar185 * fStack_5b0 + fVar211 * auVar181._16_4_;
          auVar272._12_4_ = fVar208 * fStack_5ac + fVar73 * auVar181._20_4_;
          auVar175 = vsubps_avx(auVar340,auVar118);
          auVar165 = vmovshdup_avx(_local_5e8);
          auVar229 = vmovsldup_avx(_local_5e8);
          local_5e8._0_4_ = auVar175._0_4_ * auVar229._0_4_ + auVar165._0_4_ * auVar118._0_4_;
          local_5e8._4_4_ = auVar175._4_4_ * auVar229._4_4_ + auVar165._4_4_ * auVar118._4_4_;
          fStack_5e0 = auVar175._8_4_ * auVar229._8_4_ + auVar165._8_4_ * auVar118._8_4_;
          fStack_5dc = auVar175._12_4_ * auVar229._12_4_ + auVar165._12_4_ * auVar118._12_4_;
          auVar75 = vmovshdup_avx(_local_5e8);
          auVar118 = vsubps_avx(auVar198,auVar149);
          auVar225._0_4_ = auVar118._0_4_ * 3.0;
          auVar225._4_4_ = auVar118._4_4_ * 3.0;
          auVar225._8_4_ = auVar118._8_4_ * 3.0;
          auVar225._12_4_ = auVar118._12_4_ * 3.0;
          auVar118 = vsubps_avx(auVar253,auVar198);
          auVar239._0_4_ = auVar118._0_4_ * 3.0;
          auVar239._4_4_ = auVar118._4_4_ * 3.0;
          auVar239._8_4_ = auVar118._8_4_ * 3.0;
          auVar239._12_4_ = auVar118._12_4_ * 3.0;
          auVar118 = vsubps_avx(auVar272,auVar253);
          auVar284._0_4_ = auVar118._0_4_ * 3.0;
          auVar284._4_4_ = auVar118._4_4_ * 3.0;
          auVar284._8_4_ = auVar118._8_4_ * 3.0;
          auVar284._12_4_ = auVar118._12_4_ * 3.0;
          auVar165 = vminps_avx(auVar239,auVar284);
          auVar118 = vmaxps_avx(auVar239,auVar284);
          auVar165 = vminps_avx(auVar225,auVar165);
          auVar118 = vmaxps_avx(auVar225,auVar118);
          auVar229 = vshufpd_avx(auVar165,auVar165,3);
          auVar175 = vshufpd_avx(auVar118,auVar118,3);
          auVar165 = vminps_avx(auVar165,auVar229);
          auVar118 = vmaxps_avx(auVar118,auVar175);
          auVar229 = vshufps_avx(ZEXT416((uint)(1.0 / fVar156)),ZEXT416((uint)(1.0 / fVar156)),0);
          auVar226._0_4_ = auVar229._0_4_ * auVar165._0_4_;
          auVar226._4_4_ = auVar229._4_4_ * auVar165._4_4_;
          auVar226._8_4_ = auVar229._8_4_ * auVar165._8_4_;
          auVar226._12_4_ = auVar229._12_4_ * auVar165._12_4_;
          auVar240._0_4_ = auVar118._0_4_ * auVar229._0_4_;
          auVar240._4_4_ = auVar118._4_4_ * auVar229._4_4_;
          auVar240._8_4_ = auVar118._8_4_ * auVar229._8_4_;
          auVar240._12_4_ = auVar118._12_4_ * auVar229._12_4_;
          auVar91 = ZEXT416((uint)(1.0 / (auVar75._0_4_ - (float)local_5e8._0_4_)));
          auVar118 = vshufpd_avx(auVar149,auVar149,3);
          auVar165 = vshufpd_avx(auVar198,auVar198,3);
          auVar229 = vshufpd_avx(auVar253,auVar253,3);
          auVar175 = vshufpd_avx(auVar272,auVar272,3);
          auVar118 = vsubps_avx(auVar118,auVar149);
          auVar117 = vsubps_avx(auVar165,auVar198);
          auVar174 = vsubps_avx(auVar229,auVar253);
          auVar175 = vsubps_avx(auVar175,auVar272);
          auVar165 = vminps_avx(auVar118,auVar117);
          auVar118 = vmaxps_avx(auVar118,auVar117);
          auVar229 = vminps_avx(auVar174,auVar175);
          auVar229 = vminps_avx(auVar165,auVar229);
          auVar165 = vmaxps_avx(auVar174,auVar175);
          auVar118 = vmaxps_avx(auVar118,auVar165);
          auVar165 = vshufps_avx(auVar91,auVar91,0);
          auVar298._0_4_ = auVar165._0_4_ * auVar229._0_4_;
          auVar298._4_4_ = auVar165._4_4_ * auVar229._4_4_;
          auVar298._8_4_ = auVar165._8_4_ * auVar229._8_4_;
          auVar298._12_4_ = auVar165._12_4_ * auVar229._12_4_;
          auVar306._0_4_ = auVar165._0_4_ * auVar118._0_4_;
          auVar306._4_4_ = auVar165._4_4_ * auVar118._4_4_;
          auVar306._8_4_ = auVar165._8_4_ * auVar118._8_4_;
          auVar306._12_4_ = auVar165._12_4_ * auVar118._12_4_;
          auVar118 = vmovsldup_avx(_local_5e8);
          auVar254._4_12_ = auVar118._4_12_;
          auVar254._0_4_ = fVar157;
          auVar273._4_12_ = local_5e8._4_12_;
          auVar273._0_4_ = fVar155;
          auVar92._0_4_ = (fVar155 + fVar157) * 0.5;
          auVar92._4_4_ = ((float)local_5e8._4_4_ + auVar118._4_4_) * 0.5;
          auVar92._8_4_ = (fStack_5e0 + auVar118._8_4_) * 0.5;
          auVar92._12_4_ = (fStack_5dc + auVar118._12_4_) * 0.5;
          auVar118 = vshufps_avx(auVar92,auVar92,0);
          fVar182 = auVar118._0_4_;
          fVar183 = auVar118._4_4_;
          fVar184 = auVar118._8_4_;
          fVar185 = auVar118._12_4_;
          local_548 = auVar18._0_4_;
          fStack_544 = auVar18._4_4_;
          fStack_540 = auVar18._8_4_;
          fStack_53c = auVar18._12_4_;
          auVar199._0_4_ = fVar182 * (float)local_238._0_4_ + local_548;
          auVar199._4_4_ = fVar183 * (float)local_238._4_4_ + fStack_544;
          auVar199._8_4_ = fVar184 * fStack_230 + fStack_540;
          auVar199._12_4_ = fVar185 * fStack_22c + fStack_53c;
          local_558 = auVar143._0_4_;
          fStack_554 = auVar143._4_4_;
          fStack_550 = auVar143._8_4_;
          fStack_54c = auVar143._12_4_;
          auVar285._0_4_ = fVar182 * (float)local_248._0_4_ + local_558;
          auVar285._4_4_ = fVar183 * (float)local_248._4_4_ + fStack_554;
          auVar285._8_4_ = fVar184 * fStack_240 + fStack_550;
          auVar285._12_4_ = fVar185 * fStack_23c + fStack_54c;
          local_568 = auVar19._0_4_;
          fStack_564 = auVar19._4_4_;
          fStack_560 = auVar19._8_4_;
          fStack_55c = auVar19._12_4_;
          auVar320._0_4_ = fVar182 * (float)local_258._0_4_ + local_568;
          auVar320._4_4_ = fVar183 * (float)local_258._4_4_ + fStack_564;
          auVar320._8_4_ = fVar184 * fStack_250 + fStack_560;
          auVar320._12_4_ = fVar185 * fStack_24c + fStack_55c;
          auVar118 = vsubps_avx(auVar285,auVar199);
          auVar200._0_4_ = auVar118._0_4_ * fVar182 + auVar199._0_4_;
          auVar200._4_4_ = auVar118._4_4_ * fVar183 + auVar199._4_4_;
          auVar200._8_4_ = auVar118._8_4_ * fVar184 + auVar199._8_4_;
          auVar200._12_4_ = auVar118._12_4_ * fVar185 + auVar199._12_4_;
          auVar118 = vsubps_avx(auVar320,auVar285);
          auVar286._0_4_ = auVar285._0_4_ + auVar118._0_4_ * fVar182;
          auVar286._4_4_ = auVar285._4_4_ + auVar118._4_4_ * fVar183;
          auVar286._8_4_ = auVar285._8_4_ + auVar118._8_4_ * fVar184;
          auVar286._12_4_ = auVar285._12_4_ + auVar118._12_4_ * fVar185;
          auVar118 = vsubps_avx(auVar286,auVar200);
          fVar182 = auVar200._0_4_ + auVar118._0_4_ * fVar182;
          fVar183 = auVar200._4_4_ + auVar118._4_4_ * fVar183;
          auVar150._0_8_ = CONCAT44(fVar183,fVar182);
          auVar150._8_4_ = auVar200._8_4_ + auVar118._8_4_ * fVar184;
          auVar150._12_4_ = auVar200._12_4_ + auVar118._12_4_ * fVar185;
          fVar184 = auVar118._0_4_ * 3.0;
          fVar185 = auVar118._4_4_ * 3.0;
          auVar201._0_8_ = CONCAT44(fVar185,fVar184);
          auVar201._8_4_ = auVar118._8_4_ * 3.0;
          auVar201._12_4_ = auVar118._12_4_ * 3.0;
          auVar287._8_8_ = auVar150._0_8_;
          auVar287._0_8_ = auVar150._0_8_;
          auVar118 = vshufpd_avx(auVar150,auVar150,3);
          auVar165 = vshufps_avx(auVar92,auVar92,0x55);
          auVar174 = vsubps_avx(auVar118,auVar287);
          auVar288._0_4_ = auVar165._0_4_ * auVar174._0_4_ + fVar182;
          auVar288._4_4_ = auVar165._4_4_ * auVar174._4_4_ + fVar183;
          auVar288._8_4_ = auVar165._8_4_ * auVar174._8_4_ + fVar182;
          auVar288._12_4_ = auVar165._12_4_ * auVar174._12_4_ + fVar183;
          auVar328._8_8_ = auVar201._0_8_;
          auVar328._0_8_ = auVar201._0_8_;
          auVar118 = vshufpd_avx(auVar201,auVar201,1);
          auVar118 = vsubps_avx(auVar118,auVar328);
          auVar202._0_4_ = fVar184 + auVar165._0_4_ * auVar118._0_4_;
          auVar202._4_4_ = fVar185 + auVar165._4_4_ * auVar118._4_4_;
          auVar202._8_4_ = fVar184 + auVar165._8_4_ * auVar118._8_4_;
          auVar202._12_4_ = fVar185 + auVar165._12_4_ * auVar118._12_4_;
          auVar165 = vmovshdup_avx(auVar202);
          auVar329._0_8_ = auVar165._0_8_ ^ 0x8000000080000000;
          auVar329._8_4_ = auVar165._8_4_ ^ 0x80000000;
          auVar329._12_4_ = auVar165._12_4_ ^ 0x80000000;
          auVar229 = vmovshdup_avx(auVar174);
          auVar118 = vunpcklps_avx(auVar229,auVar329);
          auVar175 = vshufps_avx(auVar118,auVar329,4);
          auVar151._0_8_ = auVar174._0_8_ ^ 0x8000000080000000;
          auVar151._8_4_ = -auVar174._8_4_;
          auVar151._12_4_ = -auVar174._12_4_;
          auVar118 = vmovlhps_avx(auVar151,auVar202);
          auVar117 = vshufps_avx(auVar118,auVar202,8);
          auVar118 = ZEXT416((uint)(auVar229._0_4_ * auVar202._0_4_ -
                                   auVar165._0_4_ * auVar174._0_4_));
          auVar165 = vshufps_avx(auVar118,auVar118,0);
          auVar118 = vdivps_avx(auVar175,auVar165);
          auVar165 = vdivps_avx(auVar117,auVar165);
          auVar117 = vinsertps_avx(auVar226,auVar298,0x1c);
          auVar174 = vinsertps_avx(auVar240,auVar306,0x1c);
          auVar91 = vinsertps_avx(auVar298,auVar226,0x4c);
          auVar147 = vinsertps_avx(auVar306,auVar240,0x4c);
          auVar229 = vmovsldup_avx(auVar118);
          auVar307._0_4_ = auVar229._0_4_ * auVar117._0_4_;
          auVar307._4_4_ = auVar229._4_4_ * auVar117._4_4_;
          auVar307._8_4_ = auVar229._8_4_ * auVar117._8_4_;
          auVar307._12_4_ = auVar229._12_4_ * auVar117._12_4_;
          auVar299._0_4_ = auVar229._0_4_ * auVar174._0_4_;
          auVar299._4_4_ = auVar229._4_4_ * auVar174._4_4_;
          auVar299._8_4_ = auVar229._8_4_ * auVar174._8_4_;
          auVar299._12_4_ = auVar229._12_4_ * auVar174._12_4_;
          auVar175 = vminps_avx(auVar307,auVar299);
          auVar229 = vmaxps_avx(auVar299,auVar307);
          auVar20 = vmovsldup_avx(auVar165);
          auVar349._0_4_ = auVar20._0_4_ * auVar91._0_4_;
          auVar349._4_4_ = auVar20._4_4_ * auVar91._4_4_;
          auVar349._8_4_ = auVar20._8_4_ * auVar91._8_4_;
          auVar349._12_4_ = auVar20._12_4_ * auVar91._12_4_;
          auVar300._0_4_ = auVar20._0_4_ * auVar147._0_4_;
          auVar300._4_4_ = auVar20._4_4_ * auVar147._4_4_;
          auVar300._8_4_ = auVar20._8_4_ * auVar147._8_4_;
          auVar300._12_4_ = auVar20._12_4_ * auVar147._12_4_;
          auVar20 = vminps_avx(auVar349,auVar300);
          auVar120._0_4_ = auVar175._0_4_ + auVar20._0_4_;
          auVar120._4_4_ = auVar175._4_4_ + auVar20._4_4_;
          auVar120._8_4_ = auVar175._8_4_ + auVar20._8_4_;
          auVar120._12_4_ = auVar175._12_4_ + auVar20._12_4_;
          auVar175 = vmaxps_avx(auVar300,auVar349);
          auVar20 = vsubps_avx(auVar254,auVar92);
          auVar76 = vsubps_avx(auVar273,auVar92);
          auVar274._0_4_ = auVar229._0_4_ + auVar175._0_4_;
          auVar274._4_4_ = auVar229._4_4_ + auVar175._4_4_;
          auVar274._8_4_ = auVar229._8_4_ + auVar175._8_4_;
          auVar274._12_4_ = auVar229._12_4_ + auVar175._12_4_;
          auVar308._8_8_ = 0x3f800000;
          auVar308._0_8_ = 0x3f800000;
          auVar229 = vsubps_avx(auVar308,auVar274);
          auVar175 = vsubps_avx(auVar308,auVar120);
          fVar210 = auVar20._0_4_;
          auVar309._0_4_ = fVar210 * auVar229._0_4_;
          fVar211 = auVar20._4_4_;
          auVar309._4_4_ = fVar211 * auVar229._4_4_;
          fVar73 = auVar20._8_4_;
          auVar309._8_4_ = fVar73 * auVar229._8_4_;
          fVar98 = auVar20._12_4_;
          auVar309._12_4_ = fVar98 * auVar229._12_4_;
          fVar184 = auVar76._0_4_;
          auVar275._0_4_ = auVar229._0_4_ * fVar184;
          fVar185 = auVar76._4_4_;
          auVar275._4_4_ = auVar229._4_4_ * fVar185;
          fVar208 = auVar76._8_4_;
          auVar275._8_4_ = auVar229._8_4_ * fVar208;
          fVar209 = auVar76._12_4_;
          auVar275._12_4_ = auVar229._12_4_ * fVar209;
          auVar341._0_4_ = fVar210 * auVar175._0_4_;
          auVar341._4_4_ = fVar211 * auVar175._4_4_;
          auVar341._8_4_ = fVar73 * auVar175._8_4_;
          auVar341._12_4_ = fVar98 * auVar175._12_4_;
          auVar121._0_4_ = fVar184 * auVar175._0_4_;
          auVar121._4_4_ = fVar185 * auVar175._4_4_;
          auVar121._8_4_ = fVar208 * auVar175._8_4_;
          auVar121._12_4_ = fVar209 * auVar175._12_4_;
          auVar229 = vminps_avx(auVar309,auVar341);
          auVar175 = vminps_avx(auVar275,auVar121);
          auVar20 = vminps_avx(auVar229,auVar175);
          auVar229 = vmaxps_avx(auVar341,auVar309);
          auVar175 = vmaxps_avx(auVar121,auVar275);
          auVar76 = vshufps_avx(auVar92,auVar92,0x54);
          auVar175 = vmaxps_avx(auVar175,auVar229);
          auVar77 = vshufps_avx(auVar288,auVar288,0);
          auVar102 = vshufps_avx(auVar288,auVar288,0x55);
          auVar229 = vhaddps_avx(auVar20,auVar20);
          auVar175 = vhaddps_avx(auVar175,auVar175);
          auVar276._0_4_ = auVar77._0_4_ * auVar118._0_4_ + auVar102._0_4_ * auVar165._0_4_;
          auVar276._4_4_ = auVar77._4_4_ * auVar118._4_4_ + auVar102._4_4_ * auVar165._4_4_;
          auVar276._8_4_ = auVar77._8_4_ * auVar118._8_4_ + auVar102._8_4_ * auVar165._8_4_;
          auVar276._12_4_ = auVar77._12_4_ * auVar118._12_4_ + auVar102._12_4_ * auVar165._12_4_;
          auVar20 = vsubps_avx(auVar76,auVar276);
          fVar182 = auVar20._0_4_ + auVar229._0_4_;
          fVar183 = auVar20._0_4_ + auVar175._0_4_;
          auVar229 = vmaxss_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar182));
          auVar175 = vminss_avx(ZEXT416((uint)fVar183),ZEXT416((uint)fVar155));
          if (auVar229._0_4_ <= auVar175._0_4_) {
            auVar229 = vmovshdup_avx(auVar118);
            auVar171._0_4_ = auVar117._0_4_ * auVar229._0_4_;
            auVar171._4_4_ = auVar117._4_4_ * auVar229._4_4_;
            auVar171._8_4_ = auVar117._8_4_ * auVar229._8_4_;
            auVar171._12_4_ = auVar117._12_4_ * auVar229._12_4_;
            auVar122._0_4_ = auVar174._0_4_ * auVar229._0_4_;
            auVar122._4_4_ = auVar174._4_4_ * auVar229._4_4_;
            auVar122._8_4_ = auVar174._8_4_ * auVar229._8_4_;
            auVar122._12_4_ = auVar174._12_4_ * auVar229._12_4_;
            auVar175 = vminps_avx(auVar171,auVar122);
            auVar229 = vmaxps_avx(auVar122,auVar171);
            auVar117 = vmovshdup_avx(auVar165);
            auVar227._0_4_ = auVar117._0_4_ * auVar91._0_4_;
            auVar227._4_4_ = auVar117._4_4_ * auVar91._4_4_;
            auVar227._8_4_ = auVar117._8_4_ * auVar91._8_4_;
            auVar227._12_4_ = auVar117._12_4_ * auVar91._12_4_;
            auVar172._0_4_ = auVar117._0_4_ * auVar147._0_4_;
            auVar172._4_4_ = auVar117._4_4_ * auVar147._4_4_;
            auVar172._8_4_ = auVar117._8_4_ * auVar147._8_4_;
            auVar172._12_4_ = auVar117._12_4_ * auVar147._12_4_;
            auVar117 = vminps_avx(auVar227,auVar172);
            auVar241._0_4_ = auVar175._0_4_ + auVar117._0_4_;
            auVar241._4_4_ = auVar175._4_4_ + auVar117._4_4_;
            auVar241._8_4_ = auVar175._8_4_ + auVar117._8_4_;
            auVar241._12_4_ = auVar175._12_4_ + auVar117._12_4_;
            auVar175 = vmaxps_avx(auVar172,auVar227);
            auVar123._0_4_ = auVar229._0_4_ + auVar175._0_4_;
            auVar123._4_4_ = auVar229._4_4_ + auVar175._4_4_;
            auVar123._8_4_ = auVar229._8_4_ + auVar175._8_4_;
            auVar123._12_4_ = auVar229._12_4_ + auVar175._12_4_;
            auVar229 = vsubps_avx(auVar170,auVar123);
            auVar175 = vsubps_avx(auVar170,auVar241);
            auVar228._0_4_ = fVar210 * auVar229._0_4_;
            auVar228._4_4_ = fVar211 * auVar229._4_4_;
            auVar228._8_4_ = fVar73 * auVar229._8_4_;
            auVar228._12_4_ = fVar98 * auVar229._12_4_;
            auVar242._0_4_ = fVar210 * auVar175._0_4_;
            auVar242._4_4_ = fVar211 * auVar175._4_4_;
            auVar242._8_4_ = fVar73 * auVar175._8_4_;
            auVar242._12_4_ = fVar98 * auVar175._12_4_;
            auVar124._0_4_ = fVar184 * auVar229._0_4_;
            auVar124._4_4_ = fVar185 * auVar229._4_4_;
            auVar124._8_4_ = fVar208 * auVar229._8_4_;
            auVar124._12_4_ = fVar209 * auVar229._12_4_;
            auVar173._0_4_ = fVar184 * auVar175._0_4_;
            auVar173._4_4_ = fVar185 * auVar175._4_4_;
            auVar173._8_4_ = fVar208 * auVar175._8_4_;
            auVar173._12_4_ = fVar209 * auVar175._12_4_;
            auVar229 = vminps_avx(auVar228,auVar242);
            auVar175 = vminps_avx(auVar124,auVar173);
            auVar229 = vminps_avx(auVar229,auVar175);
            auVar175 = vmaxps_avx(auVar242,auVar228);
            auVar117 = vmaxps_avx(auVar173,auVar124);
            auVar229 = vhaddps_avx(auVar229,auVar229);
            auVar175 = vmaxps_avx(auVar117,auVar175);
            auVar175 = vhaddps_avx(auVar175,auVar175);
            auVar117 = vmovshdup_avx(auVar20);
            auVar174 = ZEXT416((uint)(auVar117._0_4_ + auVar229._0_4_));
            auVar229 = vmaxss_avx(_local_5e8,auVar174);
            auVar117 = ZEXT416((uint)(auVar117._0_4_ + auVar175._0_4_));
            auVar175 = vminss_avx(auVar117,auVar75);
            auVar342._8_4_ = 0x7fffffff;
            auVar342._0_8_ = 0x7fffffff7fffffff;
            auVar342._12_4_ = 0x7fffffff;
            if (auVar229._0_4_ <= auVar175._0_4_) {
              uVar66 = 0;
              auVar351 = ZEXT864(0) << 0x20;
              if ((fVar157 < fVar182) && (fVar183 < fVar155)) {
                auVar229 = vcmpps_avx(auVar117,auVar75,1);
                auVar175 = vcmpps_avx(_local_5e8,auVar174,1);
                auVar229 = vandps_avx(auVar175,auVar229);
                uVar66 = auVar229._0_4_;
              }
              if ((uVar72 < 4 && 0.001 <= fVar156) && (uVar66 & 1) == 0) {
                bVar57 = false;
              }
              else {
                lVar69 = 200;
                do {
                  fVar182 = auVar20._0_4_;
                  fVar156 = 1.0 - fVar182;
                  auVar229 = ZEXT416((uint)(fVar156 * fVar156 * fVar156));
                  auVar229 = vshufps_avx(auVar229,auVar229,0);
                  auVar175 = ZEXT416((uint)(fVar182 * 3.0 * fVar156 * fVar156));
                  auVar175 = vshufps_avx(auVar175,auVar175,0);
                  auVar117 = ZEXT416((uint)(fVar156 * fVar182 * fVar182 * 3.0));
                  auVar117 = vshufps_avx(auVar117,auVar117,0);
                  auVar174 = ZEXT416((uint)(fVar182 * fVar182 * fVar182));
                  auVar174 = vshufps_avx(auVar174,auVar174,0);
                  fVar156 = local_548 * auVar229._0_4_ +
                            local_558 * auVar175._0_4_ +
                            (float)local_388._0_4_ * auVar174._0_4_ + local_568 * auVar117._0_4_;
                  fVar182 = fStack_544 * auVar229._4_4_ +
                            fStack_554 * auVar175._4_4_ +
                            (float)local_388._4_4_ * auVar174._4_4_ + fStack_564 * auVar117._4_4_;
                  auVar125._0_8_ = CONCAT44(fVar182,fVar156);
                  auVar125._8_4_ =
                       fStack_540 * auVar229._8_4_ +
                       fStack_550 * auVar175._8_4_ +
                       fStack_380 * auVar174._8_4_ + fStack_560 * auVar117._8_4_;
                  auVar125._12_4_ =
                       fStack_53c * auVar229._12_4_ +
                       fStack_54c * auVar175._12_4_ +
                       fStack_37c * auVar174._12_4_ + fStack_55c * auVar117._12_4_;
                  auVar176._8_8_ = auVar125._0_8_;
                  auVar176._0_8_ = auVar125._0_8_;
                  auVar175 = vshufpd_avx(auVar125,auVar125,1);
                  auVar229 = vmovshdup_avx(auVar20);
                  auVar175 = vsubps_avx(auVar175,auVar176);
                  auVar126._0_4_ = auVar229._0_4_ * auVar175._0_4_ + fVar156;
                  auVar126._4_4_ = auVar229._4_4_ * auVar175._4_4_ + fVar182;
                  auVar126._8_4_ = auVar229._8_4_ * auVar175._8_4_ + fVar156;
                  auVar126._12_4_ = auVar229._12_4_ * auVar175._12_4_ + fVar182;
                  auVar229 = vshufps_avx(auVar126,auVar126,0);
                  auVar175 = vshufps_avx(auVar126,auVar126,0x55);
                  auVar177._0_4_ = auVar118._0_4_ * auVar229._0_4_ + auVar165._0_4_ * auVar175._0_4_
                  ;
                  auVar177._4_4_ = auVar118._4_4_ * auVar229._4_4_ + auVar165._4_4_ * auVar175._4_4_
                  ;
                  auVar177._8_4_ = auVar118._8_4_ * auVar229._8_4_ + auVar165._8_4_ * auVar175._8_4_
                  ;
                  auVar177._12_4_ =
                       auVar118._12_4_ * auVar229._12_4_ + auVar165._12_4_ * auVar175._12_4_;
                  auVar20 = vsubps_avx(auVar20,auVar177);
                  auVar229 = vandps_avx(auVar342,auVar126);
                  auVar175 = vshufps_avx(auVar229,auVar229,0xf5);
                  auVar229 = vmaxss_avx(auVar175,auVar229);
                  if (auVar229._0_4_ < fVar133) {
                    fVar156 = auVar20._0_4_;
                    if ((0.0 <= fVar156) && (fVar156 <= 1.0)) {
                      auVar118 = vmovshdup_avx(auVar20);
                      fVar182 = auVar118._0_4_;
                      if ((0.0 <= fVar182) && (fVar182 <= 1.0)) {
                        auVar118 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar147 = vinsertps_avx(auVar118,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar118 = vdpps_avx(auVar147,local_268,0x7f);
                        auVar165 = vdpps_avx(auVar147,local_278,0x7f);
                        auVar229 = vdpps_avx(auVar147,local_288,0x7f);
                        auVar175 = vdpps_avx(auVar147,local_298,0x7f);
                        auVar117 = vdpps_avx(auVar147,local_2a8,0x7f);
                        auVar174 = vdpps_avx(auVar147,local_2b8,0x7f);
                        auVar91 = vdpps_avx(auVar147,local_2c8,0x7f);
                        auVar147 = vdpps_avx(auVar147,local_2d8,0x7f);
                        fVar209 = 1.0 - fVar182;
                        fVar210 = 1.0 - fVar156;
                        fVar183 = auVar20._4_4_;
                        fVar184 = auVar20._8_4_;
                        fVar185 = auVar20._12_4_;
                        fVar208 = fVar210 * fVar156 * fVar156 * 3.0;
                        auVar255._0_4_ = fVar156 * fVar156 * fVar156;
                        auVar255._4_4_ = fVar183 * fVar183 * fVar183;
                        auVar255._8_4_ = fVar184 * fVar184 * fVar184;
                        auVar255._12_4_ = fVar185 * fVar185 * fVar185;
                        fVar184 = fVar210 * fVar210 * fVar156 * 3.0;
                        fVar185 = fVar210 * fVar210 * fVar210;
                        fVar183 = fVar185 * (fVar209 * auVar118._0_4_ + fVar182 * auVar117._0_4_) +
                                  (fVar209 * auVar165._0_4_ + auVar174._0_4_ * fVar182) * fVar184 +
                                  fVar208 * (auVar91._0_4_ * fVar182 + fVar209 * auVar229._0_4_) +
                                  auVar255._0_4_ *
                                  (fVar209 * auVar175._0_4_ + fVar182 * auVar147._0_4_);
                        if (((fVar74 <= fVar183) &&
                            (fVar209 = *(float *)(ray + k * 4 + 0x80), fVar183 <= fVar209)) &&
                           (pGVar12 = (context->scene->geometries).items[uVar67].ptr,
                           (pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                          local_1a8 = vshufps_avx(auVar20,auVar20,0x55);
                          auVar289._8_4_ = 0x3f800000;
                          auVar289._0_8_ = &DAT_3f8000003f800000;
                          auVar289._12_4_ = 0x3f800000;
                          auVar118 = vsubps_avx(auVar289,local_1a8);
                          fVar211 = local_1a8._0_4_;
                          fVar73 = local_1a8._4_4_;
                          fVar98 = local_1a8._8_4_;
                          fVar99 = local_1a8._12_4_;
                          fVar100 = auVar118._0_4_;
                          fVar101 = auVar118._4_4_;
                          fVar130 = auVar118._8_4_;
                          fVar131 = auVar118._12_4_;
                          auVar301._0_4_ =
                               fVar211 * (float)local_3c8._0_4_ + fVar100 * (float)local_398._0_4_;
                          auVar301._4_4_ =
                               fVar73 * (float)local_3c8._4_4_ + fVar101 * (float)local_398._4_4_;
                          auVar301._8_4_ = fVar98 * fStack_3c0 + fVar130 * fStack_390;
                          auVar301._12_4_ = fVar99 * fStack_3bc + fVar131 * fStack_38c;
                          auVar310._0_4_ = fVar211 * (float)local_3d8._0_4_ + fVar100 * fVar212;
                          auVar310._4_4_ = fVar73 * (float)local_3d8._4_4_ + fVar101 * fVar231;
                          auVar310._8_4_ = fVar98 * fStack_3d0 + fVar130 * fVar232;
                          auVar310._12_4_ = fVar99 * fStack_3cc + fVar131 * fVar233;
                          auVar321._0_4_ =
                               fVar211 * (float)local_3e8._0_4_ + fVar100 * (float)local_3a8._0_4_;
                          auVar321._4_4_ =
                               fVar73 * (float)local_3e8._4_4_ + fVar101 * (float)local_3a8._4_4_;
                          auVar321._8_4_ = fVar98 * fStack_3e0 + fVar130 * fStack_3a0;
                          auVar321._12_4_ = fVar99 * fStack_3dc + fVar131 * fStack_39c;
                          auVar290._0_4_ = fVar211 * local_3f8 + fVar100 * (float)local_3b8._0_4_;
                          auVar290._4_4_ = fVar73 * fStack_3f4 + fVar101 * (float)local_3b8._4_4_;
                          auVar290._8_4_ = fVar98 * fStack_3f0 + fVar130 * fStack_3b0;
                          auVar290._12_4_ = fVar99 * fStack_3ec + fVar131 * fStack_3ac;
                          auVar175 = vsubps_avx(auVar310,auVar301);
                          auVar117 = vsubps_avx(auVar321,auVar310);
                          auVar174 = vsubps_avx(auVar290,auVar321);
                          local_1b8 = vshufps_avx(auVar20,auVar20,0);
                          fVar99 = local_1b8._0_4_;
                          fVar100 = local_1b8._4_4_;
                          fVar101 = local_1b8._8_4_;
                          fVar130 = local_1b8._12_4_;
                          auVar118 = vshufps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),0);
                          fVar210 = auVar118._0_4_;
                          fVar211 = auVar118._4_4_;
                          fVar73 = auVar118._8_4_;
                          fVar98 = auVar118._12_4_;
                          auVar118 = vshufps_avx(auVar255,auVar255,0);
                          auVar165 = vshufps_avx(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),0);
                          auVar229 = vshufps_avx(ZEXT416((uint)fVar184),ZEXT416((uint)fVar184),0);
                          auVar243._0_4_ =
                               (fVar210 * (fVar210 * auVar175._0_4_ + fVar99 * auVar117._0_4_) +
                               fVar99 * (fVar210 * auVar117._0_4_ + fVar99 * auVar174._0_4_)) * 3.0;
                          auVar243._4_4_ =
                               (fVar211 * (fVar211 * auVar175._4_4_ + fVar100 * auVar117._4_4_) +
                               fVar100 * (fVar211 * auVar117._4_4_ + fVar100 * auVar174._4_4_)) *
                               3.0;
                          auVar243._8_4_ =
                               (fVar73 * (fVar73 * auVar175._8_4_ + fVar101 * auVar117._8_4_) +
                               fVar101 * (fVar73 * auVar117._8_4_ + fVar101 * auVar174._8_4_)) * 3.0
                          ;
                          auVar243._12_4_ =
                               (fVar98 * (fVar98 * auVar175._12_4_ + fVar130 * auVar117._12_4_) +
                               fVar130 * (fVar98 * auVar117._12_4_ + fVar130 * auVar174._12_4_)) *
                               3.0;
                          auVar175 = vshufps_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),0);
                          auVar203._0_4_ =
                               auVar175._0_4_ * (float)local_2f8._0_4_ +
                               auVar229._0_4_ * (float)local_308._0_4_ +
                               auVar118._0_4_ * (float)local_328._0_4_ +
                               auVar165._0_4_ * (float)local_318._0_4_;
                          auVar203._4_4_ =
                               auVar175._4_4_ * (float)local_2f8._4_4_ +
                               auVar229._4_4_ * (float)local_308._4_4_ +
                               auVar118._4_4_ * (float)local_328._4_4_ +
                               auVar165._4_4_ * (float)local_318._4_4_;
                          auVar203._8_4_ =
                               auVar175._8_4_ * fStack_2f0 +
                               auVar229._8_4_ * fStack_300 +
                               auVar118._8_4_ * fStack_320 + auVar165._8_4_ * fStack_310;
                          auVar203._12_4_ =
                               auVar175._12_4_ * fStack_2ec +
                               auVar229._12_4_ * fStack_2fc +
                               auVar118._12_4_ * fStack_31c + auVar165._12_4_ * fStack_30c;
                          auVar118 = vshufps_avx(auVar243,auVar243,0xc9);
                          auVar230._0_4_ = auVar203._0_4_ * auVar118._0_4_;
                          auVar230._4_4_ = auVar203._4_4_ * auVar118._4_4_;
                          auVar230._8_4_ = auVar203._8_4_ * auVar118._8_4_;
                          auVar230._12_4_ = auVar203._12_4_ * auVar118._12_4_;
                          auVar118 = vshufps_avx(auVar203,auVar203,0xc9);
                          auVar204._0_4_ = auVar243._0_4_ * auVar118._0_4_;
                          auVar204._4_4_ = auVar243._4_4_ * auVar118._4_4_;
                          auVar204._8_4_ = auVar243._8_4_ * auVar118._8_4_;
                          auVar204._12_4_ = auVar243._12_4_ * auVar118._12_4_;
                          auVar118 = vsubps_avx(auVar204,auVar230);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar183;
                            uVar9 = vextractps_avx(auVar118,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar9;
                            uVar9 = vextractps_avx(auVar118,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar9;
                            *(int *)(ray + k * 4 + 0xe0) = auVar118._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar156;
                            *(float *)(ray + k * 4 + 0x100) = fVar182;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_438;
                            *(uint *)(ray + k * 4 + 0x120) = uVar67;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            auVar165 = vshufps_avx(auVar118,auVar118,0x55);
                            local_1d8 = vshufps_avx(auVar118,auVar118,0xaa);
                            local_1c8 = vshufps_avx(auVar118,auVar118,0);
                            local_1e8[0] = (RTCHitN)auVar165[0];
                            local_1e8[1] = (RTCHitN)auVar165[1];
                            local_1e8[2] = (RTCHitN)auVar165[2];
                            local_1e8[3] = (RTCHitN)auVar165[3];
                            local_1e8[4] = (RTCHitN)auVar165[4];
                            local_1e8[5] = (RTCHitN)auVar165[5];
                            local_1e8[6] = (RTCHitN)auVar165[6];
                            local_1e8[7] = (RTCHitN)auVar165[7];
                            local_1e8[8] = (RTCHitN)auVar165[8];
                            local_1e8[9] = (RTCHitN)auVar165[9];
                            local_1e8[10] = (RTCHitN)auVar165[10];
                            local_1e8[0xb] = (RTCHitN)auVar165[0xb];
                            local_1e8[0xc] = (RTCHitN)auVar165[0xc];
                            local_1e8[0xd] = (RTCHitN)auVar165[0xd];
                            local_1e8[0xe] = (RTCHitN)auVar165[0xe];
                            local_1e8[0xf] = (RTCHitN)auVar165[0xf];
                            local_198 = local_358._0_8_;
                            uStack_190 = local_358._8_8_;
                            local_188 = local_348._0_8_;
                            uStack_180 = local_348._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_174 = context->user->instID[0];
                            local_178 = uStack_174;
                            uStack_170 = uStack_174;
                            uStack_16c = uStack_174;
                            uStack_168 = context->user->instPrimID[0];
                            uStack_164 = uStack_168;
                            uStack_160 = uStack_168;
                            uStack_15c = uStack_168;
                            *(float *)(ray + k * 4 + 0x80) = fVar183;
                            local_458 = *local_448;
                            uStack_450 = local_448[1];
                            local_428.valid = (int *)&local_458;
                            local_428.geometryUserPtr = pGVar12->userPtr;
                            local_428.context = context->user;
                            local_428.hit = local_1e8;
                            local_428.N = 4;
                            local_428.ray = (RTCRayN *)ray;
                            if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar12->intersectionFilterN)(&local_428);
                            }
                            auVar62._8_8_ = uStack_450;
                            auVar62._0_8_ = local_458;
                            if (auVar62 == (undefined1  [16])0x0) {
                              auVar351 = ZEXT1664(ZEXT816(0));
                              auVar118 = vpcmpeqd_avx(ZEXT816(0),(undefined1  [16])0x0);
                              auVar118 = auVar118 ^ _DAT_01febe20;
                            }
                            else {
                              p_Var17 = context->args->filter;
                              auVar351 = ZEXT1664(ZEXT816(0));
                              auVar118 = vpcmpeqd_avx(auVar62,auVar62);
                              if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar351._0_8_ = (*p_Var17)(&local_428);
                                auVar351._8_56_ = extraout_var;
                                auVar118 = vpcmpeqd_avx(auVar351._0_16_,auVar351._0_16_);
                                auVar351 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar63._8_8_ = uStack_450;
                              auVar63._0_8_ = local_458;
                              auVar165 = vpcmpeqd_avx(auVar351._0_16_,auVar63);
                              auVar118 = auVar165 ^ auVar118;
                              auVar229 = vpcmpeqd_avx(auVar63,auVar63);
                              if (auVar63 != (undefined1  [16])0x0) {
                                auVar165 = auVar165 ^ auVar229;
                                auVar229 = vmaskmovps_avx(auVar165,*(undefined1 (*) [16])
                                                                    local_428.hit);
                                *(undefined1 (*) [16])(local_428.ray + 0xc0) = auVar229;
                                auVar229 = vmaskmovps_avx(auVar165,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x10));
                                *(undefined1 (*) [16])(local_428.ray + 0xd0) = auVar229;
                                auVar229 = vmaskmovps_avx(auVar165,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x20));
                                *(undefined1 (*) [16])(local_428.ray + 0xe0) = auVar229;
                                auVar229 = vmaskmovps_avx(auVar165,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x30));
                                *(undefined1 (*) [16])(local_428.ray + 0xf0) = auVar229;
                                auVar229 = vmaskmovps_avx(auVar165,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x40));
                                *(undefined1 (*) [16])(local_428.ray + 0x100) = auVar229;
                                auVar229 = vmaskmovps_avx(auVar165,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x50));
                                *(undefined1 (*) [16])(local_428.ray + 0x110) = auVar229;
                                auVar229 = vmaskmovps_avx(auVar165,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x60));
                                *(undefined1 (*) [16])(local_428.ray + 0x120) = auVar229;
                                auVar229 = vmaskmovps_avx(auVar165,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x70));
                                *(undefined1 (*) [16])(local_428.ray + 0x130) = auVar229;
                                auVar165 = vmaskmovps_avx(auVar165,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x80));
                                *(undefined1 (*) [16])(local_428.ray + 0x140) = auVar165;
                              }
                            }
                            auVar127._8_8_ = 0x100000001;
                            auVar127._0_8_ = 0x100000001;
                            if ((auVar127 & auVar118) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar209;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar69 = lVar69 + -1;
                } while (lVar69 != 0);
              }
              goto LAB_00ffdf78;
            }
          }
          goto LAB_00ffdf8b;
        }
      }
LAB_00ffdf78:
    } while (bVar57);
    _local_538 = ZEXT416((uint)fVar157);
    local_2e8 = vinsertps_avx(_local_538,ZEXT416((uint)fVar155),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }